

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  size_t k;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [8];
  RTCHitN *pRVar61;
  RayK<8> *pRVar62;
  byte bVar63;
  byte bVar64;
  int iVar65;
  AABBNodeMB4D *node1;
  ulong uVar66;
  undefined4 uVar67;
  byte bVar68;
  undefined1 (*pauVar69) [32];
  long lVar70;
  uint uVar71;
  ulong uVar72;
  byte bVar73;
  QuadMesh *mesh;
  uint uVar74;
  NodeRef root;
  ulong *puVar75;
  bool bVar76;
  ulong uVar77;
  ulong uVar78;
  undefined1 auVar80 [16];
  float fVar79;
  float fVar121;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar133;
  float fVar134;
  undefined1 auVar132 [32];
  float fVar135;
  undefined1 auVar136 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 in_ZMM2 [64];
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar152;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [64];
  undefined1 auVar164 [16];
  float fVar163;
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar166 [64];
  float fVar173;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 in_ZMM6 [64];
  float fVar182;
  undefined1 auVar183 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 in_ZMM7 [64];
  float fVar190;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar200 [36];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 in_ZMM10 [64];
  float fVar210;
  undefined1 auVar211 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar226 [36];
  undefined1 auVar225 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar227 [64];
  undefined1 auVar229 [36];
  undefined1 auVar228 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2b09;
  ulong local_2b08;
  ulong local_2b00;
  BVH *local_2af8;
  RayK<8> *local_2af0;
  undefined4 local_2ae4;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [8];
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  undefined4 uStack_2a84;
  float local_2a80 [4];
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  undefined4 uStack_2a64;
  undefined1 local_2a60 [32];
  Intersectors *local_2a40;
  undefined1 (*local_2a38) [32];
  ulong local_2a30;
  ulong local_2a28;
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [8];
  float fStack_29b8;
  float fStack_29b4;
  float fStack_29b0;
  float fStack_29ac;
  float fStack_29a8;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  uint uStack_2984;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  uint local_2900;
  uint uStack_28fc;
  uint uStack_28f8;
  uint uStack_28f4;
  uint uStack_28f0;
  uint uStack_28ec;
  uint uStack_28e8;
  uint uStack_28e4;
  uint local_28e0;
  uint uStack_28dc;
  uint uStack_28d8;
  uint uStack_28d4;
  uint uStack_28d0;
  uint uStack_28cc;
  uint uStack_28c8;
  uint uStack_28c4;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  float fStack_2728;
  undefined4 uStack_2724;
  int local_2720;
  int iStack_271c;
  int iStack_2718;
  int iStack_2714;
  int iStack_2710;
  int iStack_270c;
  int iStack_2708;
  int iStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar107 [32];
  
  local_2af8 = (BVH *)This->ptr;
  if ((local_2af8->root).ptr != 8) {
    auVar84 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar82 = ZEXT816(0) << 0x40;
    uVar77 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar82),5);
    uVar66 = vpcmpeqd_avx512vl(auVar84,(undefined1  [32])valid_i->field_0);
    uVar77 = uVar77 & uVar66;
    bVar64 = (byte)uVar77;
    if (bVar64 != 0) {
      local_2840._0_8_ = *(undefined8 *)ray;
      local_2840._8_8_ = *(undefined8 *)(ray + 8);
      local_2840._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2840._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2840._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2840._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2840._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2840._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2840._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2840._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2840._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2840._88_8_ = *(undefined8 *)(ray + 0x58);
      local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar234 = ZEXT3264(auVar84);
      vandps_avx512vl(local_27e0,auVar84);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar235 = ZEXT3264(auVar85);
      uVar66 = vcmpps_avx512vl(auVar84,auVar85,1);
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar236 = ZEXT3264(auVar86);
      auVar87 = vdivps_avx512vl(auVar86,local_27e0);
      vandps_avx512vl(local_27c0,auVar84);
      uVar72 = vcmpps_avx512vl(auVar87,auVar85,1);
      auVar88 = vdivps_avx512vl(auVar86,local_27c0);
      vandps_avx512vl(local_27a0,auVar84);
      uVar78 = vcmpps_avx512vl(auVar88,auVar85,1);
      auVar84 = vdivps_avx512vl(auVar86,local_27a0);
      auVar166 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                    CONCAT424(0x5d5e0b6b,
                                              CONCAT420(0x5d5e0b6b,
                                                        CONCAT416(0x5d5e0b6b,
                                                                  CONCAT412(0x5d5e0b6b,
                                                                            CONCAT48(0x5d5e0b6b,
                                                                                                                                                                          
                                                  0x5d5e0b6b5d5e0b6b)))))));
      bVar76 = (bool)((byte)uVar66 & 1);
      local_2780._0_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._0_4_;
      bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
      local_2780._4_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._4_4_;
      bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
      local_2780._8_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._8_4_;
      bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
      local_2780._12_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._12_4_;
      bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
      local_2780._16_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._16_4_;
      bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
      local_2780._20_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._20_4_;
      bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
      local_2780._24_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._24_4_;
      bVar76 = SUB81(uVar66 >> 7,0);
      local_2780._28_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar87._28_4_;
      bVar76 = (bool)((byte)uVar72 & 1);
      local_2760._0_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._0_4_;
      bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
      local_2760._4_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._4_4_;
      bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
      fStack_2758 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._8_4_);
      bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
      fStack_2754 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._12_4_);
      bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
      fStack_2750 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._16_4_);
      bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
      fStack_274c = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._20_4_);
      bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
      fStack_2748 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._24_4_);
      bVar76 = SUB81(uVar72 >> 7,0);
      uStack_2744 = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar88._28_4_;
      bVar76 = (bool)((byte)uVar78 & 1);
      local_2740._0_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._0_4_;
      bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
      local_2740._4_4_ = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._4_4_;
      bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
      fStack_2738 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._8_4_);
      bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
      fStack_2734 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._12_4_);
      bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
      fStack_2730 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._16_4_);
      bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
      fStack_272c = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._20_4_);
      bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
      fStack_2728 = (float)((uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._24_4_);
      bVar76 = SUB81(uVar78 >> 7,0);
      uStack_2724 = (uint)bVar76 * 0x5d5e0b6b | (uint)!bVar76 * auVar84._28_4_;
      auVar156 = ZEXT3264(_local_2740);
      uVar66 = vcmpps_avx512vl(local_2780,ZEXT1632(auVar82),1);
      auVar84 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2720 = (uint)((byte)uVar66 & 1) * auVar84._0_4_;
      iStack_271c = (uint)((byte)(uVar66 >> 1) & 1) * auVar84._4_4_;
      iStack_2718 = (uint)((byte)(uVar66 >> 2) & 1) * auVar84._8_4_;
      iStack_2714 = (uint)((byte)(uVar66 >> 3) & 1) * auVar84._12_4_;
      iStack_2710 = (uint)((byte)(uVar66 >> 4) & 1) * auVar84._16_4_;
      iStack_270c = (uint)((byte)(uVar66 >> 5) & 1) * auVar84._20_4_;
      iStack_2708 = (uint)((byte)(uVar66 >> 6) & 1) * auVar84._24_4_;
      iStack_2704 = (uint)(byte)(uVar66 >> 7) * auVar84._28_4_;
      auVar85 = ZEXT1632(auVar82);
      uVar66 = vcmpps_avx512vl(_local_2760,auVar85,5);
      auVar84 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar76 = (bool)((byte)uVar66 & 1);
      bVar7 = (bool)((byte)(uVar66 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar66 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar66 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
      bVar13 = SUB81(uVar66 >> 7,0);
      local_2700 = (uint)bVar76 * auVar84._0_4_ | (uint)!bVar76 * 0x30;
      uStack_26fc = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * 0x30;
      uStack_26f8 = (uint)bVar8 * auVar84._8_4_ | (uint)!bVar8 * 0x30;
      uStack_26f4 = (uint)bVar9 * auVar84._12_4_ | (uint)!bVar9 * 0x30;
      uStack_26f0 = (uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * 0x30;
      uStack_26ec = (uint)bVar11 * auVar84._20_4_ | (uint)!bVar11 * 0x30;
      uStack_26e8 = (uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * 0x30;
      uStack_26e4 = (uint)bVar13 * auVar84._28_4_ | (uint)!bVar13 * 0x30;
      uVar66 = vcmpps_avx512vl(_local_2740,auVar85,5);
      auVar84 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar76 = (bool)((byte)uVar66 & 1);
      bVar7 = (bool)((byte)(uVar66 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar66 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar66 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar66 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
      bVar13 = SUB81(uVar66 >> 7,0);
      local_26e0 = (uint)bVar76 * auVar84._0_4_ | (uint)!bVar76 * 0x50;
      uStack_26dc = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * 0x50;
      uStack_26d8 = (uint)bVar8 * auVar84._8_4_ | (uint)!bVar8 * 0x50;
      uStack_26d4 = (uint)bVar9 * auVar84._12_4_ | (uint)!bVar9 * 0x50;
      uStack_26d0 = (uint)bVar10 * auVar84._16_4_ | (uint)!bVar10 * 0x50;
      uStack_26cc = (uint)bVar11 * auVar84._20_4_ | (uint)!bVar11 * 0x50;
      uStack_26c8 = (uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * 0x50;
      uStack_26c4 = (uint)bVar13 * auVar84._28_4_ | (uint)!bVar13 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar238 = ZEXT3264(local_1e80);
      local_2ae4 = (undefined4)uVar77;
      auVar84 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar85);
      local_26c0._0_4_ =
           (uint)(bVar64 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar64 & 1) * local_1e80._0_4_;
      bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
      local_26c0._4_4_ = (uint)bVar76 * auVar84._4_4_ | (uint)!bVar76 * local_1e80._4_4_;
      bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
      local_26c0._8_4_ = (uint)bVar76 * auVar84._8_4_ | (uint)!bVar76 * local_1e80._8_4_;
      bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
      local_26c0._12_4_ = (uint)bVar76 * auVar84._12_4_ | (uint)!bVar76 * local_1e80._12_4_;
      bVar76 = (bool)((byte)(uVar77 >> 4) & 1);
      local_26c0._16_4_ = (uint)bVar76 * auVar84._16_4_ | (uint)!bVar76 * local_1e80._16_4_;
      bVar76 = (bool)((byte)(uVar77 >> 5) & 1);
      local_26c0._20_4_ = (uint)bVar76 * auVar84._20_4_ | (uint)!bVar76 * local_1e80._20_4_;
      bVar76 = (bool)((byte)(uVar77 >> 6) & 1);
      local_26c0._24_4_ = (uint)bVar76 * auVar84._24_4_ | (uint)!bVar76 * local_1e80._24_4_;
      bVar76 = SUB81(uVar77 >> 7,0);
      local_26c0._28_4_ = (uint)bVar76 * auVar84._28_4_ | (uint)!bVar76 * local_1e80._28_4_;
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar237 = ZEXT3264(auVar84);
      auVar85 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar85);
      local_26a0._0_4_ =
           (uint)(bVar64 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar84._0_4_;
      bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
      local_26a0._4_4_ = (uint)bVar76 * auVar85._4_4_ | (uint)!bVar76 * auVar84._4_4_;
      bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
      local_26a0._8_4_ = (uint)bVar76 * auVar85._8_4_ | (uint)!bVar76 * auVar84._8_4_;
      bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
      local_26a0._12_4_ = (uint)bVar76 * auVar85._12_4_ | (uint)!bVar76 * auVar84._12_4_;
      bVar76 = (bool)((byte)(uVar77 >> 4) & 1);
      local_26a0._16_4_ = (uint)bVar76 * auVar85._16_4_ | (uint)!bVar76 * auVar84._16_4_;
      bVar76 = (bool)((byte)(uVar77 >> 5) & 1);
      local_26a0._20_4_ = (uint)bVar76 * auVar85._20_4_ | (uint)!bVar76 * auVar84._20_4_;
      bVar76 = (bool)((byte)(uVar77 >> 6) & 1);
      local_26a0._24_4_ = (uint)bVar76 * auVar85._24_4_ | (uint)!bVar76 * auVar84._24_4_;
      bVar76 = SUB81(uVar77 >> 7,0);
      local_26a0._28_4_ = (uint)bVar76 * auVar85._28_4_ | (uint)!bVar76 * auVar84._28_4_;
      bVar64 = ~bVar64;
      local_2a40 = This;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar71 = 5;
      }
      else {
        uVar71 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2af0 = ray + 0x100;
      puVar75 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar69 = (undefined1 (*) [32])local_1e40;
      local_2608 = (local_2af8->root).ptr;
      local_1e60 = local_26c0;
      local_2a38 = (undefined1 (*) [32])&local_2900;
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar239 = ZEXT3264(auVar84);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar230 = ZEXT3264(auVar84);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar233 = ZEXT3264(auVar84);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar232 = ZEXT3264(auVar84);
      do {
        pauVar69 = pauVar69 + -1;
        root.ptr = puVar75[-1];
        puVar75 = puVar75 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_007b11fb:
          iVar65 = 3;
        }
        else {
          local_2a60 = *pauVar69;
          uVar77 = vcmpps_avx512vl(local_2a60,local_26a0,1);
          if ((char)uVar77 == '\0') {
LAB_007b120c:
            iVar65 = 2;
          }
          else {
            uVar67 = (undefined4)uVar77;
            iVar65 = 0;
            if ((uint)POPCOUNT(uVar67) <= uVar71) {
              do {
                k = 0;
                for (uVar66 = uVar77; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                auVar156 = ZEXT1664(auVar156._0_16_);
                auVar166 = ZEXT1664(auVar166._0_16_);
                in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                bVar76 = occluded1(local_2a40,local_2af8,root,k,&local_2b09,ray,
                                   (TravRayK<8,_true> *)&local_2840.field_0,context);
                bVar63 = (byte)(1 << ((uint)k & 0x1f));
                if (!bVar76) {
                  bVar63 = 0;
                }
                bVar64 = bVar64 | bVar63;
                uVar77 = uVar77 - 1 & uVar77;
              } while (uVar77 != 0);
              if (bVar64 == 0xff) {
                iVar65 = 3;
              }
              else {
                auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar76 = (bool)(bVar64 >> 1 & 1);
                bVar7 = (bool)(bVar64 >> 2 & 1);
                bVar8 = (bool)(bVar64 >> 3 & 1);
                bVar9 = (bool)(bVar64 >> 4 & 1);
                bVar10 = (bool)(bVar64 >> 5 & 1);
                bVar11 = (bool)(bVar64 >> 6 & 1);
                local_26a0._4_4_ = (uint)bVar76 * auVar84._4_4_ | (uint)!bVar76 * local_26a0._4_4_;
                local_26a0._0_4_ =
                     (uint)(bVar64 & 1) * auVar84._0_4_ |
                     (uint)!(bool)(bVar64 & 1) * local_26a0._0_4_;
                local_26a0._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * local_26a0._8_4_;
                local_26a0._12_4_ = (uint)bVar8 * auVar84._12_4_ | (uint)!bVar8 * local_26a0._12_4_;
                local_26a0._16_4_ = (uint)bVar9 * auVar84._16_4_ | (uint)!bVar9 * local_26a0._16_4_;
                local_26a0._20_4_ =
                     (uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * local_26a0._20_4_;
                local_26a0._24_4_ =
                     (uint)bVar11 * auVar84._24_4_ | (uint)!bVar11 * local_26a0._24_4_;
                local_26a0._28_4_ =
                     (uint)(bVar64 >> 7) * auVar84._28_4_ |
                     (uint)!(bool)(bVar64 >> 7) * local_26a0._28_4_;
                iVar65 = 2;
              }
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar234 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar235 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar236 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar237 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar238 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar239 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar230 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
              auVar233 = ZEXT3264(auVar84);
              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar232 = ZEXT3264(auVar84);
            }
            auVar231 = ZEXT3264(local_2a60);
            if (uVar71 < (uint)POPCOUNT(uVar67)) {
              do {
                auVar84 = auVar231._0_32_;
                uVar74 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_007b11fb;
                  uVar16 = vcmpps_avx512vl(auVar84,local_26a0,9);
                  if ((char)uVar16 != '\0') {
                    local_2a30 = (ulong)(uVar74 & 0xf) - 8;
                    bVar63 = bVar64;
                    if (local_2a30 != 0) {
                      bVar63 = ~bVar64;
                      uVar77 = 0;
                      do {
                        lVar70 = uVar77 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        local_2b08 = 0;
                        local_2b00 = (ulong)bVar63;
                        for (uVar66 = local_2b00; (uVar66 & 1) == 0;
                            uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                          local_2b08 = local_2b08 + 1;
                        }
                        local_2a28 = uVar77;
                        uVar77 = 0;
                        bVar73 = bVar63;
                        while( true ) {
                          fVar201 = in_ZMM8._28_4_;
                          auVar226 = in_ZMM14._28_36_;
                          auVar229 = in_ZMM15._28_36_;
                          auVar200 = in_ZMM9._28_36_;
                          if (*(int *)(lVar70 + 0x50 + uVar77 * 4) == -1) break;
                          pGVar2 = (context->scene->geometries).items
                                   [*(uint *)(lVar70 + 0x40 + uVar77 * 4)].ptr;
                          fVar203 = (pGVar2->time_range).lower;
                          auVar84._4_4_ = fVar203;
                          auVar84._0_4_ = fVar203;
                          auVar84._8_4_ = fVar203;
                          auVar84._12_4_ = fVar203;
                          auVar84._16_4_ = fVar203;
                          auVar84._20_4_ = fVar203;
                          auVar84._24_4_ = fVar203;
                          auVar84._28_4_ = fVar203;
                          fVar125 = pGVar2->fnumTimeSegments;
                          auVar85 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar84);
                          fVar203 = (pGVar2->time_range).upper - fVar203;
                          auVar87._4_4_ = fVar203;
                          auVar87._0_4_ = fVar203;
                          auVar87._8_4_ = fVar203;
                          auVar87._12_4_ = fVar203;
                          auVar87._16_4_ = fVar203;
                          auVar87._20_4_ = fVar203;
                          auVar87._24_4_ = fVar203;
                          auVar87._28_4_ = fVar203;
                          auVar84 = vdivps_avx(auVar85,auVar87);
                          auVar86._4_4_ = fVar125 * auVar84._4_4_;
                          auVar86._0_4_ = fVar125 * auVar84._0_4_;
                          auVar86._8_4_ = fVar125 * auVar84._8_4_;
                          auVar86._12_4_ = fVar125 * auVar84._12_4_;
                          auVar86._16_4_ = fVar125 * auVar84._16_4_;
                          auVar86._20_4_ = fVar125 * auVar84._20_4_;
                          auVar86._24_4_ = fVar125 * auVar84._24_4_;
                          auVar86._28_4_ = auVar84._28_4_;
                          auVar84 = vroundps_avx(auVar86,1);
                          fVar125 = fVar125 + -1.0;
                          auVar88._4_4_ = fVar125;
                          auVar88._0_4_ = fVar125;
                          auVar88._8_4_ = fVar125;
                          auVar88._12_4_ = fVar125;
                          auVar88._16_4_ = fVar125;
                          auVar88._20_4_ = fVar125;
                          auVar88._24_4_ = fVar125;
                          auVar88._28_4_ = fVar125;
                          auVar84 = vminps_avx(auVar84,auVar88);
                          auVar84 = vmaxps_avx(auVar84,_DAT_02020f00);
                          local_2ae0 = vcvtps2dq_avx(auVar84);
                          fVar203 = local_2ae0._28_4_;
                          auVar84 = vsubps_avx(auVar86,auVar84);
                          auVar86 = vpbroadcastd_avx512vl();
                          uVar16 = vpcmpeqd_avx512vl(auVar86,local_2ae0);
                          auVar86 = auVar236._0_32_;
                          if ((byte)((byte)uVar16 | ~bVar63) == 0xff) {
                            lVar3 = *(long *)(*(long *)&pGVar2[2].numPrimitives +
                                             (long)*(int *)(local_2ae0 + local_2b08 * 4) * 0x38);
                            lVar4 = *(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                             (long)*(int *)(local_2ae0 + local_2b08 * 4) * 0x38);
                            uVar66 = (ulong)*(uint *)(lVar70 + uVar77 * 4);
                            uVar72 = (ulong)*(uint *)(lVar70 + 0x10 + uVar77 * 4);
                            auVar87 = vsubps_avx512vl(auVar86,auVar84);
                            uVar67 = *(undefined4 *)(lVar4 + uVar66 * 4);
                            auVar98._4_4_ = uVar67;
                            auVar98._0_4_ = uVar67;
                            auVar98._8_4_ = uVar67;
                            auVar98._12_4_ = uVar67;
                            auVar98._16_4_ = uVar67;
                            auVar98._20_4_ = uVar67;
                            auVar98._24_4_ = uVar67;
                            auVar98._28_4_ = uVar67;
                            auVar85 = vmulps_avx512vl(auVar84,auVar98);
                            uVar67 = *(undefined4 *)(lVar4 + 4 + uVar66 * 4);
                            auVar99._4_4_ = uVar67;
                            auVar99._0_4_ = uVar67;
                            auVar99._8_4_ = uVar67;
                            auVar99._12_4_ = uVar67;
                            auVar99._16_4_ = uVar67;
                            auVar99._20_4_ = uVar67;
                            auVar99._24_4_ = uVar67;
                            auVar99._28_4_ = uVar67;
                            auVar88 = vmulps_avx512vl(auVar84,auVar99);
                            uVar67 = *(undefined4 *)(lVar4 + 8 + uVar66 * 4);
                            auVar100._4_4_ = uVar67;
                            auVar100._0_4_ = uVar67;
                            auVar100._8_4_ = uVar67;
                            auVar100._12_4_ = uVar67;
                            auVar100._16_4_ = uVar67;
                            auVar100._20_4_ = uVar67;
                            auVar100._24_4_ = uVar67;
                            auVar100._28_4_ = uVar67;
                            auVar89 = vmulps_avx512vl(auVar84,auVar100);
                            uVar67 = *(undefined4 *)(lVar3 + uVar66 * 4);
                            auVar101._4_4_ = uVar67;
                            auVar101._0_4_ = uVar67;
                            auVar101._8_4_ = uVar67;
                            auVar101._12_4_ = uVar67;
                            auVar101._16_4_ = uVar67;
                            auVar101._20_4_ = uVar67;
                            auVar101._24_4_ = uVar67;
                            auVar101._28_4_ = uVar67;
                            auVar92 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar101);
                            uVar67 = *(undefined4 *)(lVar3 + 4 + uVar66 * 4);
                            auVar102._4_4_ = uVar67;
                            auVar102._0_4_ = uVar67;
                            auVar102._8_4_ = uVar67;
                            auVar102._12_4_ = uVar67;
                            auVar102._16_4_ = uVar67;
                            auVar102._20_4_ = uVar67;
                            auVar102._24_4_ = uVar67;
                            auVar102._28_4_ = uVar67;
                            auVar93 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar102);
                            uVar67 = *(undefined4 *)(lVar3 + 8 + uVar66 * 4);
                            auVar103._4_4_ = uVar67;
                            auVar103._0_4_ = uVar67;
                            auVar103._8_4_ = uVar67;
                            auVar103._12_4_ = uVar67;
                            auVar103._16_4_ = uVar67;
                            auVar103._20_4_ = uVar67;
                            auVar103._24_4_ = uVar67;
                            auVar103._28_4_ = uVar67;
                            auVar85 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar103);
                            uVar67 = *(undefined4 *)(lVar4 + uVar72 * 4);
                            auVar104._4_4_ = uVar67;
                            auVar104._0_4_ = uVar67;
                            auVar104._8_4_ = uVar67;
                            auVar104._12_4_ = uVar67;
                            auVar104._16_4_ = uVar67;
                            auVar104._20_4_ = uVar67;
                            auVar104._24_4_ = uVar67;
                            auVar104._28_4_ = uVar67;
                            auVar88 = vmulps_avx512vl(auVar84,auVar104);
                            uVar67 = *(undefined4 *)(lVar4 + 4 + uVar72 * 4);
                            auVar106._4_4_ = uVar67;
                            auVar106._0_4_ = uVar67;
                            auVar106._8_4_ = uVar67;
                            auVar106._12_4_ = uVar67;
                            auVar106._16_4_ = uVar67;
                            auVar106._20_4_ = uVar67;
                            auVar106._24_4_ = uVar67;
                            auVar106._28_4_ = uVar67;
                            auVar89 = vmulps_avx512vl(auVar84,auVar106);
                            uVar67 = *(undefined4 *)(lVar4 + 8 + uVar72 * 4);
                            auVar111._4_4_ = uVar67;
                            auVar111._0_4_ = uVar67;
                            auVar111._8_4_ = uVar67;
                            auVar111._12_4_ = uVar67;
                            auVar111._16_4_ = uVar67;
                            auVar111._20_4_ = uVar67;
                            auVar111._24_4_ = uVar67;
                            auVar111._28_4_ = uVar67;
                            auVar90 = vmulps_avx512vl(auVar84,auVar111);
                            uVar67 = *(undefined4 *)(lVar3 + uVar72 * 4);
                            auVar112._4_4_ = uVar67;
                            auVar112._0_4_ = uVar67;
                            auVar112._8_4_ = uVar67;
                            auVar112._12_4_ = uVar67;
                            auVar112._16_4_ = uVar67;
                            auVar112._20_4_ = uVar67;
                            auVar112._24_4_ = uVar67;
                            auVar112._28_4_ = uVar67;
                            local_2640 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar112);
                            uVar67 = *(undefined4 *)(lVar3 + 4 + uVar72 * 4);
                            auVar27._4_4_ = uVar67;
                            auVar27._0_4_ = uVar67;
                            auVar27._8_4_ = uVar67;
                            auVar27._12_4_ = uVar67;
                            auVar27._16_4_ = uVar67;
                            auVar27._20_4_ = uVar67;
                            auVar27._24_4_ = uVar67;
                            auVar27._28_4_ = uVar67;
                            local_2660 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar27);
                            uVar67 = *(undefined4 *)(lVar3 + 8 + uVar72 * 4);
                            auVar28._4_4_ = uVar67;
                            auVar28._0_4_ = uVar67;
                            auVar28._8_4_ = uVar67;
                            auVar28._12_4_ = uVar67;
                            auVar28._16_4_ = uVar67;
                            auVar28._20_4_ = uVar67;
                            auVar28._24_4_ = uVar67;
                            auVar28._28_4_ = uVar67;
                            local_2680 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar28);
                            uVar66 = (ulong)*(uint *)(lVar70 + 0x20 + uVar77 * 4);
                            uVar67 = *(undefined4 *)(lVar4 + uVar66 * 4);
                            auVar29._4_4_ = uVar67;
                            auVar29._0_4_ = uVar67;
                            auVar29._8_4_ = uVar67;
                            auVar29._12_4_ = uVar67;
                            auVar29._16_4_ = uVar67;
                            auVar29._20_4_ = uVar67;
                            auVar29._24_4_ = uVar67;
                            auVar29._28_4_ = uVar67;
                            auVar88 = vmulps_avx512vl(auVar84,auVar29);
                            uVar67 = *(undefined4 *)(lVar4 + 4 + uVar66 * 4);
                            auVar30._4_4_ = uVar67;
                            auVar30._0_4_ = uVar67;
                            auVar30._8_4_ = uVar67;
                            auVar30._12_4_ = uVar67;
                            auVar30._16_4_ = uVar67;
                            auVar30._20_4_ = uVar67;
                            auVar30._24_4_ = uVar67;
                            auVar30._28_4_ = uVar67;
                            auVar89 = vmulps_avx512vl(auVar84,auVar30);
                            uVar67 = *(undefined4 *)(lVar4 + 8 + uVar66 * 4);
                            auVar31._4_4_ = uVar67;
                            auVar31._0_4_ = uVar67;
                            auVar31._8_4_ = uVar67;
                            auVar31._12_4_ = uVar67;
                            auVar31._16_4_ = uVar67;
                            auVar31._20_4_ = uVar67;
                            auVar31._24_4_ = uVar67;
                            auVar31._28_4_ = uVar67;
                            auVar90 = vmulps_avx512vl(auVar84,auVar31);
                            uVar67 = *(undefined4 *)(lVar3 + uVar66 * 4);
                            auVar32._4_4_ = uVar67;
                            auVar32._0_4_ = uVar67;
                            auVar32._8_4_ = uVar67;
                            auVar32._12_4_ = uVar67;
                            auVar32._16_4_ = uVar67;
                            auVar32._20_4_ = uVar67;
                            auVar32._24_4_ = uVar67;
                            auVar32._28_4_ = uVar67;
                            local_2860 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar32);
                            uVar67 = *(undefined4 *)(lVar3 + 4 + uVar66 * 4);
                            auVar33._4_4_ = uVar67;
                            auVar33._0_4_ = uVar67;
                            auVar33._8_4_ = uVar67;
                            auVar33._12_4_ = uVar67;
                            auVar33._16_4_ = uVar67;
                            auVar33._20_4_ = uVar67;
                            auVar33._24_4_ = uVar67;
                            auVar33._28_4_ = uVar67;
                            local_2880 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar33);
                            uVar67 = *(undefined4 *)(lVar3 + 8 + uVar66 * 4);
                            auVar34._4_4_ = uVar67;
                            auVar34._0_4_ = uVar67;
                            auVar34._8_4_ = uVar67;
                            auVar34._12_4_ = uVar67;
                            auVar34._16_4_ = uVar67;
                            auVar34._20_4_ = uVar67;
                            auVar34._24_4_ = uVar67;
                            auVar34._28_4_ = uVar67;
                            local_28a0 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar34);
                            uVar66 = (ulong)*(uint *)(lVar70 + 0x30 + uVar77 * 4);
                            uVar67 = *(undefined4 *)(lVar4 + uVar66 * 4);
                            auVar35._4_4_ = uVar67;
                            auVar35._0_4_ = uVar67;
                            auVar35._8_4_ = uVar67;
                            auVar35._12_4_ = uVar67;
                            auVar35._16_4_ = uVar67;
                            auVar35._20_4_ = uVar67;
                            auVar35._24_4_ = uVar67;
                            auVar35._28_4_ = uVar67;
                            auVar88 = vmulps_avx512vl(auVar84,auVar35);
                            uVar67 = *(undefined4 *)(lVar4 + 4 + uVar66 * 4);
                            auVar36._4_4_ = uVar67;
                            auVar36._0_4_ = uVar67;
                            auVar36._8_4_ = uVar67;
                            auVar36._12_4_ = uVar67;
                            auVar36._16_4_ = uVar67;
                            auVar36._20_4_ = uVar67;
                            auVar36._24_4_ = uVar67;
                            auVar36._28_4_ = uVar67;
                            auVar89 = vmulps_avx512vl(auVar84,auVar36);
                            uVar67 = *(undefined4 *)(lVar4 + 8 + uVar66 * 4);
                            auVar37._4_4_ = uVar67;
                            auVar37._0_4_ = uVar67;
                            auVar37._8_4_ = uVar67;
                            auVar37._12_4_ = uVar67;
                            auVar37._16_4_ = uVar67;
                            auVar37._20_4_ = uVar67;
                            auVar37._24_4_ = uVar67;
                            auVar37._28_4_ = uVar67;
                            auVar84 = vmulps_avx512vl(auVar84,auVar37);
                            uVar67 = *(undefined4 *)(lVar3 + uVar66 * 4);
                            auVar38._4_4_ = uVar67;
                            auVar38._0_4_ = uVar67;
                            auVar38._8_4_ = uVar67;
                            auVar38._12_4_ = uVar67;
                            auVar38._16_4_ = uVar67;
                            auVar38._20_4_ = uVar67;
                            auVar38._24_4_ = uVar67;
                            auVar38._28_4_ = uVar67;
                            local_2a60 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar38);
                            uVar67 = *(undefined4 *)(lVar3 + 4 + uVar66 * 4);
                            auVar39._4_4_ = uVar67;
                            auVar39._0_4_ = uVar67;
                            auVar39._8_4_ = uVar67;
                            auVar39._12_4_ = uVar67;
                            auVar39._16_4_ = uVar67;
                            auVar39._20_4_ = uVar67;
                            auVar39._24_4_ = uVar67;
                            auVar39._28_4_ = uVar67;
                            local_2a00 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar39);
                            uVar67 = *(undefined4 *)(lVar3 + 8 + uVar66 * 4);
                            auVar40._4_4_ = uVar67;
                            auVar40._0_4_ = uVar67;
                            auVar40._8_4_ = uVar67;
                            auVar40._12_4_ = uVar67;
                            auVar40._16_4_ = uVar67;
                            auVar40._20_4_ = uVar67;
                            auVar40._24_4_ = uVar67;
                            auVar40._28_4_ = uVar67;
                            local_2a20 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar40);
                          }
                          else {
                            auVar60 = local_2ac0;
                            pRVar61 = local_2aa0;
                            if (bVar63 != 0) {
                              lVar3 = *(long *)&pGVar2[2].numPrimitives;
                              uVar78 = (ulong)*(uint *)(lVar70 + uVar77 * 4);
                              uVar72 = local_2b00;
                              uVar66 = local_2b08;
                              do {
                                auVar82 = *(undefined1 (*) [16])
                                           (*(long *)(lVar3 + (long)*(int *)(local_2ae0 + uVar66 * 4
                                                                            ) * 0x38) + uVar78 * 4);
                                auVar83 = *(undefined1 (*) [16])
                                           (*(long *)(lVar3 + 0x38 +
                                                     (long)*(int *)(local_2ae0 + uVar66 * 4) * 0x38)
                                           + uVar78 * 4);
                                fVar203 = 0.0;
                                *(int *)(local_29e0 + uVar66 * 4) = auVar82._0_4_;
                                uVar67 = vextractps_avx(auVar82,1);
                                *(undefined4 *)(local_29c0 + uVar66 * 4) = uVar67;
                                uVar67 = vextractps_avx(auVar82,2);
                                *(undefined4 *)(local_29a0 + uVar66 * 4) = uVar67;
                                *(int *)(local_2ac0 + uVar66 * 4) = auVar83._0_4_;
                                uVar67 = vextractps_avx(auVar83,1);
                                *(undefined4 *)((long)&local_2aa0 + uVar66 * 4) = uVar67;
                                fVar125 = (float)vextractps_avx(auVar83,2);
                                local_2a80[uVar66] = fVar125;
                                uVar72 = uVar72 ^ 1L << (uVar66 & 0x3f);
                                uVar66 = 0;
                                for (uVar14 = uVar72; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar66 = uVar66 + 1;
                                }
                                auVar60 = local_2ac0;
                                pRVar61 = local_2aa0;
                              } while (uVar72 != 0);
                            }
                            local_2aa0._4_4_ = (float)((ulong)pRVar61 >> 0x20);
                            local_2aa0._0_4_ = SUB84(pRVar61,0);
                            local_2ac0._4_4_ = (undefined4)((ulong)auVar60 >> 0x20);
                            local_2ac0._0_4_ = SUB84(auVar60,0);
                            auVar87 = vsubps_avx512vl(auVar86,auVar84);
                            fVar120 = auVar87._0_4_;
                            fVar135 = fVar120 * (float)local_29e0._0_4_;
                            fVar121 = auVar87._4_4_;
                            fVar137 = fVar121 * (float)local_29e0._4_4_;
                            fVar122 = auVar87._8_4_;
                            fVar138 = fVar122 * fStack_29d8;
                            fVar123 = auVar87._12_4_;
                            fVar139 = fVar123 * fStack_29d4;
                            fVar124 = auVar87._16_4_;
                            fVar140 = fVar124 * fStack_29d0;
                            fVar133 = auVar87._20_4_;
                            fVar141 = fVar133 * fStack_29cc;
                            fVar134 = auVar87._24_4_;
                            fVar142 = fVar134 * fStack_29c8;
                            fVar143 = fVar120 * (float)local_29c0._0_4_;
                            fVar146 = fVar121 * (float)local_29c0._4_4_;
                            fVar147 = fVar122 * fStack_29b8;
                            fVar148 = fVar123 * fStack_29b4;
                            fVar149 = fVar124 * fStack_29b0;
                            fVar150 = fVar133 * fStack_29ac;
                            fVar151 = fVar134 * fStack_29a8;
                            fVar152 = fVar120 * (float)local_29a0._0_4_;
                            fVar157 = fVar121 * (float)local_29a0._4_4_;
                            fVar158 = fVar122 * fStack_2998;
                            fVar159 = fVar123 * fStack_2994;
                            fVar160 = fVar124 * fStack_2990;
                            fVar161 = fVar133 * fStack_298c;
                            fVar162 = fVar134 * fStack_2988;
                            fVar125 = auVar84._0_4_;
                            fVar163 = fVar125 * (float)local_2ac0._0_4_;
                            fVar128 = auVar84._4_4_;
                            fVar167 = fVar128 * (float)local_2ac0._4_4_;
                            fVar129 = auVar84._8_4_;
                            fVar168 = fVar129 * fStack_2ab8;
                            fVar130 = auVar84._12_4_;
                            fVar169 = fVar130 * fStack_2ab4;
                            fVar131 = auVar84._16_4_;
                            fVar170 = fVar131 * fStack_2ab0;
                            fVar79 = auVar84._20_4_;
                            fVar171 = fVar79 * fStack_2aac;
                            fVar119 = auVar84._24_4_;
                            fVar172 = fVar119 * (float)uStack_2aa8;
                            fVar173 = fVar125 * (float)local_2aa0;
                            fVar176 = fVar128 * local_2aa0._4_4_;
                            fVar177 = fVar129 * fStack_2a98;
                            fVar178 = fVar130 * fStack_2a94;
                            fVar179 = fVar131 * fStack_2a90;
                            fVar180 = fVar79 * fStack_2a8c;
                            fVar181 = fVar119 * fStack_2a88;
                            fVar182 = fVar125 * local_2a80[0];
                            fVar184 = fVar128 * local_2a80[1];
                            fVar185 = fVar129 * local_2a80[2];
                            fVar186 = fVar130 * local_2a80[3];
                            fVar187 = fVar131 * fStack_2a70;
                            fVar188 = fVar79 * fStack_2a6c;
                            fVar189 = fVar119 * fStack_2a68;
                            if (bVar63 != 0) {
                              lVar3 = *(long *)&pGVar2[2].numPrimitives;
                              uVar78 = (ulong)*(uint *)(lVar70 + 0x10 + uVar77 * 4);
                              uVar72 = local_2b00;
                              uVar66 = local_2b08;
                              local_2ac0 = auVar60;
                              local_2aa0 = pRVar61;
                              do {
                                auVar82 = *(undefined1 (*) [16])
                                           (*(long *)(lVar3 + (long)*(int *)(local_2ae0 + uVar66 * 4
                                                                            ) * 0x38) + uVar78 * 4);
                                fVar201 = 0.0;
                                auVar83 = *(undefined1 (*) [16])
                                           (*(long *)(lVar3 + 0x38 +
                                                     (long)*(int *)(local_2ae0 + uVar66 * 4) * 0x38)
                                           + uVar78 * 4);
                                auVar200 = (undefined1  [36])0x0;
                                *(int *)(local_29e0 + uVar66 * 4) = auVar82._0_4_;
                                uVar67 = vextractps_avx(auVar82,1);
                                *(undefined4 *)(local_29c0 + uVar66 * 4) = uVar67;
                                uVar67 = vextractps_avx(auVar82,2);
                                *(undefined4 *)(local_29a0 + uVar66 * 4) = uVar67;
                                *(int *)(local_2ac0 + uVar66 * 4) = auVar83._0_4_;
                                uVar67 = vextractps_avx(auVar83,1);
                                *(undefined4 *)((long)&local_2aa0 + uVar66 * 4) = uVar67;
                                fVar190 = (float)vextractps_avx(auVar83,2);
                                local_2a80[uVar66] = fVar190;
                                uVar72 = uVar72 ^ 1L << (uVar66 & 0x3f);
                                uVar66 = 0;
                                for (uVar14 = uVar72; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar66 = uVar66 + 1;
                                }
                                auVar60 = local_2ac0;
                                pRVar61 = local_2aa0;
                              } while (uVar72 != 0);
                            }
                            local_2aa0._4_4_ = (float)((ulong)pRVar61 >> 0x20);
                            local_2aa0._0_4_ = SUB84(pRVar61,0);
                            local_2ac0._4_4_ = (undefined4)((ulong)auVar60 >> 0x20);
                            local_2ac0._0_4_ = SUB84(auVar60,0);
                            fVar190 = fVar120 * (float)local_29e0._0_4_;
                            fVar194 = fVar121 * (float)local_29e0._4_4_;
                            fVar195 = fVar122 * fStack_29d8;
                            fVar196 = fVar123 * fStack_29d4;
                            fVar197 = fVar124 * fStack_29d0;
                            fVar198 = fVar133 * fStack_29cc;
                            fVar199 = fVar134 * fStack_29c8;
                            auVar230._0_4_ = fVar120 * (float)local_29c0._0_4_;
                            auVar230._4_4_ = fVar121 * (float)local_29c0._4_4_;
                            auVar230._8_4_ = fVar122 * fStack_29b8;
                            auVar230._12_4_ = fVar123 * fStack_29b4;
                            auVar230._16_4_ = fVar124 * fStack_29b0;
                            auVar230._20_4_ = fVar133 * fStack_29ac;
                            auVar230._24_4_ = fVar134 * fStack_29a8;
                            auVar230._28_36_ = auVar200;
                            fVar202 = fVar120 * (float)local_29a0._0_4_;
                            fVar204 = fVar121 * (float)local_29a0._4_4_;
                            fVar205 = fVar122 * fStack_2998;
                            fVar206 = fVar123 * fStack_2994;
                            fVar207 = fVar124 * fStack_2990;
                            fVar208 = fVar133 * fStack_298c;
                            fVar209 = fVar134 * fStack_2988;
                            fVar210 = fVar125 * (float)local_2ac0._0_4_;
                            fVar212 = fVar128 * (float)local_2ac0._4_4_;
                            fVar213 = fVar129 * fStack_2ab8;
                            fVar214 = fVar130 * fStack_2ab4;
                            fVar215 = fVar131 * fStack_2ab0;
                            fVar216 = fVar79 * fStack_2aac;
                            fVar217 = fVar119 * (float)uStack_2aa8;
                            auVar231._0_4_ = fVar125 * (float)local_2aa0;
                            auVar231._4_4_ = fVar128 * local_2aa0._4_4_;
                            auVar231._8_4_ = fVar129 * fStack_2a98;
                            auVar231._12_4_ = fVar130 * fStack_2a94;
                            auVar231._16_4_ = fVar131 * fStack_2a90;
                            auVar231._20_4_ = fVar79 * fStack_2a8c;
                            auVar231._28_36_ = in_ZMM12._28_36_;
                            auVar231._24_4_ = fVar119 * fStack_2a88;
                            fVar218 = fVar125 * local_2a80[0];
                            fVar219 = fVar128 * local_2a80[1];
                            fVar220 = fVar129 * local_2a80[2];
                            fVar221 = fVar130 * local_2a80[3];
                            fVar222 = fVar131 * fStack_2a70;
                            fVar223 = fVar79 * fStack_2a6c;
                            fVar224 = fVar119 * fStack_2a68;
                            local_2ac0 = auVar60;
                            local_2aa0 = pRVar61;
                            pRVar62 = uStack_2aa8;
                            if (bVar63 != 0) {
                              lVar3 = *(long *)&pGVar2[2].numPrimitives;
                              uVar78 = (ulong)*(uint *)(lVar70 + 0x20 + uVar77 * 4);
                              uVar72 = local_2b00;
                              uVar66 = local_2b08;
                              do {
                                auVar82 = *(undefined1 (*) [16])
                                           (*(long *)(lVar3 + (long)*(int *)(local_2ae0 + uVar66 * 4
                                                                            ) * 0x38) + uVar78 * 4);
                                auVar226 = (undefined1  [36])0x0;
                                auVar83 = *(undefined1 (*) [16])
                                           (*(long *)(lVar3 + 0x38 +
                                                     (long)*(int *)(local_2ae0 + uVar66 * 4) * 0x38)
                                           + uVar78 * 4);
                                auVar229 = (undefined1  [36])0x0;
                                *(int *)(local_29e0 + uVar66 * 4) = auVar82._0_4_;
                                uVar67 = vextractps_avx(auVar82,1);
                                *(undefined4 *)(local_29c0 + uVar66 * 4) = uVar67;
                                uVar67 = vextractps_avx(auVar82,2);
                                *(undefined4 *)(local_29a0 + uVar66 * 4) = uVar67;
                                *(int *)(local_2ac0 + uVar66 * 4) = auVar83._0_4_;
                                uVar67 = vextractps_avx(auVar83,1);
                                *(undefined4 *)((long)&local_2aa0 + uVar66 * 4) = uVar67;
                                fVar1 = (float)vextractps_avx(auVar83,2);
                                local_2a80[uVar66] = fVar1;
                                uVar72 = uVar72 ^ 1L << (uVar66 & 0x3f);
                                uVar66 = 0;
                                for (uVar14 = uVar72; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar66 = uVar66 + 1;
                                }
                                pRVar62 = uStack_2aa8;
                              } while (uVar72 != 0);
                            }
                            uStack_2aa8._4_4_ = (undefined4)((ulong)pRVar62 >> 0x20);
                            uStack_2aa8._0_4_ = SUB84(pRVar62,0);
                            auVar228._0_4_ = fVar120 * (float)local_29e0._0_4_;
                            auVar228._4_4_ = fVar121 * (float)local_29e0._4_4_;
                            auVar228._8_4_ = fVar122 * fStack_29d8;
                            auVar228._12_4_ = fVar123 * fStack_29d4;
                            auVar228._16_4_ = fVar124 * fStack_29d0;
                            auVar228._20_4_ = fVar133 * fStack_29cc;
                            auVar228._24_4_ = fVar134 * fStack_29c8;
                            auVar228._28_36_ = auVar229;
                            auVar88 = vmulps_avx512vl(auVar87,_local_29c0);
                            auVar225._0_4_ = fVar120 * (float)local_29a0._0_4_;
                            auVar225._4_4_ = fVar121 * (float)local_29a0._4_4_;
                            auVar225._8_4_ = fVar122 * fStack_2998;
                            auVar225._12_4_ = fVar123 * fStack_2994;
                            auVar225._16_4_ = fVar124 * fStack_2990;
                            auVar225._20_4_ = fVar133 * fStack_298c;
                            auVar225._24_4_ = fVar134 * fStack_2988;
                            auVar225._28_36_ = auVar226;
                            auVar89._8_4_ = fStack_2ab8;
                            auVar89._0_8_ = local_2ac0;
                            auVar89._12_4_ = fStack_2ab4;
                            auVar89._16_4_ = fStack_2ab0;
                            auVar89._20_4_ = fStack_2aac;
                            auVar89._24_4_ = (float)uStack_2aa8;
                            auVar89._28_4_ = uStack_2aa8._4_4_;
                            auVar89 = vmulps_avx512vl(auVar84,auVar89);
                            auVar90._8_4_ = fStack_2a98;
                            auVar90._0_8_ = local_2aa0;
                            auVar90._12_4_ = fStack_2a94;
                            auVar90._16_4_ = fStack_2a90;
                            auVar90._20_4_ = fStack_2a8c;
                            auVar90._24_4_ = fStack_2a88;
                            auVar90._28_4_ = uStack_2a84;
                            auVar90 = vmulps_avx512vl(auVar84,auVar90);
                            auVar91._4_4_ = local_2a80[1];
                            auVar91._0_4_ = local_2a80[0];
                            auVar91._8_4_ = local_2a80[2];
                            auVar91._12_4_ = local_2a80[3];
                            auVar91._16_4_ = fStack_2a70;
                            auVar91._20_4_ = fStack_2a6c;
                            auVar91._24_4_ = fStack_2a68;
                            auVar91._28_4_ = uStack_2a64;
                            auVar91 = vmulps_avx512vl(auVar84,auVar91);
                            auVar60 = local_2ac0;
                            pRVar61 = local_2aa0;
                            uStack_2aa8 = pRVar62;
                            if (bVar63 != 0) {
                              lVar3 = *(long *)&pGVar2[2].numPrimitives;
                              uVar78 = (ulong)*(uint *)(lVar70 + 0x30 + uVar77 * 4);
                              uVar72 = local_2b00;
                              uVar66 = local_2b08;
                              do {
                                auVar82 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar3 + (long)*(int *)(
                                                  local_2ae0 + uVar66 * 4) * 0x38) + uVar78 * 4));
                                auVar83 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar3 + 0x38 +
                                                                        (long)*(int *)(local_2ae0 +
                                                                                      uVar66 * 4) *
                                                                        0x38) + uVar78 * 4));
                                *(int *)(local_29e0 + uVar66 * 4) = auVar82._0_4_;
                                uVar67 = vextractps_avx512f(auVar82,1);
                                *(undefined4 *)(local_29c0 + uVar66 * 4) = uVar67;
                                uVar67 = vextractps_avx512f(auVar82,2);
                                *(undefined4 *)(local_29a0 + uVar66 * 4) = uVar67;
                                *(int *)(local_2ac0 + uVar66 * 4) = auVar83._0_4_;
                                uVar67 = vextractps_avx512f(auVar83,1);
                                *(undefined4 *)((long)&local_2aa0 + uVar66 * 4) = uVar67;
                                fVar1 = (float)vextractps_avx512f(auVar83,2);
                                local_2a80[uVar66] = fVar1;
                                uVar72 = uVar72 ^ 1L << (uVar66 & 0x3f);
                                uVar66 = 0;
                                for (uVar14 = uVar72; (uVar14 & 1) == 0;
                                    uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                                  uVar66 = uVar66 + 1;
                                }
                                auVar60 = local_2ac0;
                                pRVar61 = local_2aa0;
                              } while (uVar72 != 0);
                            }
                            local_2aa0._4_4_ = (float)((ulong)pRVar61 >> 0x20);
                            local_2aa0._0_4_ = SUB84(pRVar61,0);
                            local_2ac0._4_4_ = (undefined4)((ulong)auVar60 >> 0x20);
                            local_2ac0._0_4_ = SUB84(auVar60,0);
                            auVar92._0_4_ = fVar135 + fVar163;
                            auVar92._4_4_ = fVar137 + fVar167;
                            auVar92._8_4_ = fVar138 + fVar168;
                            auVar92._12_4_ = fVar139 + fVar169;
                            auVar92._16_4_ = fVar140 + fVar170;
                            auVar92._20_4_ = fVar141 + fVar171;
                            auVar92._24_4_ = fVar142 + fVar172;
                            auVar92._28_4_ = fVar203 + auVar166._28_4_;
                            auVar93._0_4_ = fVar143 + fVar173;
                            auVar93._4_4_ = fVar146 + fVar176;
                            auVar93._8_4_ = fVar147 + fVar177;
                            auVar93._12_4_ = fVar148 + fVar178;
                            auVar93._16_4_ = fVar149 + fVar179;
                            auVar93._20_4_ = fVar150 + fVar180;
                            auVar93._24_4_ = fVar151 + fVar181;
                            auVar93._28_4_ = auVar85._28_4_ + in_ZMM6._28_4_;
                            auVar85._0_4_ = fVar152 + fVar182;
                            auVar85._4_4_ = fVar157 + fVar184;
                            auVar85._8_4_ = fVar158 + fVar185;
                            auVar85._12_4_ = fVar159 + fVar186;
                            auVar85._16_4_ = fVar160 + fVar187;
                            auVar85._20_4_ = fVar161 + fVar188;
                            auVar85._24_4_ = fVar162 + fVar189;
                            auVar85._28_4_ = auVar156._28_4_ + in_ZMM7._28_4_;
                            local_2640._0_4_ = fVar190 + fVar210;
                            local_2640._4_4_ = fVar194 + fVar212;
                            local_2640._8_4_ = fVar195 + fVar213;
                            local_2640._12_4_ = fVar196 + fVar214;
                            local_2640._16_4_ = fVar197 + fVar215;
                            local_2640._20_4_ = fVar198 + fVar216;
                            local_2640._24_4_ = fVar199 + fVar217;
                            local_2640._28_4_ = fVar201 + in_ZMM11._28_4_;
                            local_2660 = vaddps_avx512vl(auVar230._0_32_,auVar231._0_32_);
                            local_2680._0_4_ = fVar202 + fVar218;
                            local_2680._4_4_ = fVar204 + fVar219;
                            local_2680._8_4_ = fVar205 + fVar220;
                            local_2680._12_4_ = fVar206 + fVar221;
                            local_2680._16_4_ = fVar207 + fVar222;
                            local_2680._20_4_ = fVar208 + fVar223;
                            local_2680._24_4_ = fVar209 + fVar224;
                            local_2680._28_4_ = in_ZMM10._28_4_ + in_ZMM13._28_4_;
                            local_2860 = vaddps_avx512vl(auVar228._0_32_,auVar89);
                            local_2880 = vaddps_avx512vl(auVar88,auVar90);
                            auVar110._4_4_ = fVar121 * (float)local_29e0._4_4_;
                            auVar110._0_4_ = fVar120 * (float)local_29e0._0_4_;
                            auVar110._8_4_ = fVar122 * fStack_29d8;
                            auVar110._12_4_ = fVar123 * fStack_29d4;
                            auVar110._16_4_ = fVar124 * fStack_29d0;
                            auVar110._20_4_ = fVar133 * fStack_29cc;
                            auVar110._24_4_ = fVar134 * fStack_29c8;
                            auVar110._28_4_ = local_2880._28_4_;
                            auVar105._4_4_ = fVar121 * (float)local_29c0._4_4_;
                            auVar105._0_4_ = fVar120 * (float)local_29c0._0_4_;
                            auVar105._8_4_ = fVar122 * fStack_29b8;
                            auVar105._12_4_ = fVar123 * fStack_29b4;
                            auVar105._16_4_ = fVar124 * fStack_29b0;
                            auVar105._20_4_ = fVar133 * fStack_29ac;
                            auVar105._24_4_ = fVar134 * fStack_29a8;
                            auVar105._28_4_ = local_2860._28_4_;
                            local_28a0 = vaddps_avx512vl(auVar225._0_32_,auVar91);
                            auVar94._4_4_ = fVar121 * (float)local_29a0._4_4_;
                            auVar94._0_4_ = fVar120 * (float)local_29a0._0_4_;
                            auVar94._8_4_ = fVar122 * fStack_2998;
                            auVar94._12_4_ = fVar123 * fStack_2994;
                            auVar94._16_4_ = fVar124 * fStack_2990;
                            auVar94._20_4_ = fVar133 * fStack_298c;
                            auVar94._24_4_ = fVar134 * fStack_2988;
                            auVar94._28_4_ = auVar87._28_4_;
                            auVar95._4_4_ = fVar128 * (float)local_2ac0._4_4_;
                            auVar95._0_4_ = fVar125 * (float)local_2ac0._0_4_;
                            auVar95._8_4_ = fVar129 * fStack_2ab8;
                            auVar95._12_4_ = fVar130 * fStack_2ab4;
                            auVar95._16_4_ = fVar131 * fStack_2ab0;
                            auVar95._20_4_ = fVar79 * fStack_2aac;
                            auVar95._24_4_ = fVar119 * (float)uStack_2aa8;
                            auVar95._28_4_ = local_28a0._28_4_;
                            local_2a60 = vaddps_avx512vl(auVar110,auVar95);
                            auVar96._4_4_ = fVar128 * local_2aa0._4_4_;
                            auVar96._0_4_ = fVar125 * (float)local_2aa0;
                            auVar96._8_4_ = fVar129 * fStack_2a98;
                            auVar96._12_4_ = fVar130 * fStack_2a94;
                            auVar96._16_4_ = fVar131 * fStack_2a90;
                            auVar96._20_4_ = fVar79 * fStack_2a8c;
                            auVar96._24_4_ = fVar119 * fStack_2a88;
                            auVar96._28_4_ = local_2880._28_4_;
                            local_2a00 = vaddps_avx512vl(auVar105,auVar96);
                            auVar97._4_4_ = fVar128 * local_2a80[1];
                            auVar97._0_4_ = fVar125 * local_2a80[0];
                            auVar97._8_4_ = fVar129 * local_2a80[2];
                            auVar97._12_4_ = fVar130 * local_2a80[3];
                            auVar97._16_4_ = fVar131 * fStack_2a70;
                            auVar97._20_4_ = fVar79 * fStack_2a6c;
                            auVar97._24_4_ = fVar119 * fStack_2a68;
                            auVar97._28_4_ = auVar84._28_4_;
                            local_2a20 = vaddps_avx512vl(auVar94,auVar97);
                            local_2ac0 = auVar60;
                            local_2aa0 = pRVar61;
                          }
                          auVar84 = *(undefined1 (*) [32])ray;
                          auVar87 = *(undefined1 (*) [32])(ray + 0x20);
                          auVar88 = *(undefined1 (*) [32])(ray + 0x40);
                          auVar89 = *(undefined1 (*) [32])(ray + 0x80);
                          auVar166 = ZEXT3264(auVar89);
                          auVar90 = *(undefined1 (*) [32])(ray + 0xa0);
                          in_ZMM8 = ZEXT3264(auVar90);
                          auVar91 = *(undefined1 (*) [32])(ray + 0xc0);
                          in_ZMM10 = ZEXT3264(auVar91);
                          auVar92 = vsubps_avx(auVar92,auVar84);
                          auVar110 = vsubps_avx(auVar93,auVar87);
                          auVar85 = vsubps_avx(auVar85,auVar88);
                          in_ZMM9 = ZEXT3264(auVar85);
                          auVar105 = vsubps_avx(local_2640,auVar84);
                          auVar94 = vsubps_avx512vl(local_2660,auVar87);
                          auVar95 = vsubps_avx512vl(local_2680,auVar88);
                          auVar84 = vsubps_avx512vl(local_2a60,auVar84);
                          auVar87 = vsubps_avx512vl(local_2a00,auVar87);
                          auVar88 = vsubps_avx512vl(local_2a20,auVar88);
                          auVar96 = vsubps_avx512vl(auVar84,auVar92);
                          auVar97 = vsubps_avx512vl(auVar87,auVar110);
                          auVar98 = vsubps_avx512vl(auVar88,auVar85);
                          auVar99 = vsubps_avx512vl(auVar92,auVar105);
                          auVar100 = vsubps_avx512vl(auVar110,auVar94);
                          auVar101 = vsubps_avx512vl(auVar85,auVar95);
                          auVar102 = vaddps_avx512vl(auVar84,auVar92);
                          auVar103 = vaddps_avx512vl(auVar87,auVar110);
                          auVar104 = vaddps_avx512vl(auVar88,auVar85);
                          auVar44._4_4_ = auVar98._4_4_ * auVar103._4_4_;
                          auVar44._0_4_ = auVar98._0_4_ * auVar103._0_4_;
                          auVar44._8_4_ = auVar98._8_4_ * auVar103._8_4_;
                          auVar44._12_4_ = auVar98._12_4_ * auVar103._12_4_;
                          auVar44._16_4_ = auVar98._16_4_ * auVar103._16_4_;
                          auVar44._20_4_ = auVar98._20_4_ * auVar103._20_4_;
                          auVar44._24_4_ = auVar98._24_4_ * auVar103._24_4_;
                          auVar44._28_4_ = auVar93._28_4_;
                          auVar83 = vfmsub231ps_fma(auVar44,auVar97,auVar104);
                          auVar45._4_4_ = auVar96._4_4_ * auVar104._4_4_;
                          auVar45._0_4_ = auVar96._0_4_ * auVar104._0_4_;
                          auVar45._8_4_ = auVar96._8_4_ * auVar104._8_4_;
                          auVar45._12_4_ = auVar96._12_4_ * auVar104._12_4_;
                          auVar45._16_4_ = auVar96._16_4_ * auVar104._16_4_;
                          auVar45._20_4_ = auVar96._20_4_ * auVar104._20_4_;
                          auVar45._24_4_ = auVar96._24_4_ * auVar104._24_4_;
                          auVar45._28_4_ = auVar104._28_4_;
                          auVar82 = vfmsub231ps_fma(auVar45,auVar98,auVar102);
                          auVar46._4_4_ = auVar97._4_4_ * auVar102._4_4_;
                          auVar46._0_4_ = auVar97._0_4_ * auVar102._0_4_;
                          auVar46._8_4_ = auVar97._8_4_ * auVar102._8_4_;
                          auVar46._12_4_ = auVar97._12_4_ * auVar102._12_4_;
                          auVar46._16_4_ = auVar97._16_4_ * auVar102._16_4_;
                          auVar46._20_4_ = auVar97._20_4_ * auVar102._20_4_;
                          auVar46._24_4_ = auVar97._24_4_ * auVar102._24_4_;
                          auVar46._28_4_ = auVar102._28_4_;
                          auVar164 = vfmsub231ps_fma(auVar46,auVar96,auVar103);
                          fVar201 = auVar91._0_4_;
                          auVar126._0_4_ = fVar201 * auVar164._0_4_;
                          fVar203 = auVar91._4_4_;
                          auVar126._4_4_ = fVar203 * auVar164._4_4_;
                          fVar125 = auVar91._8_4_;
                          auVar126._8_4_ = fVar125 * auVar164._8_4_;
                          fVar128 = auVar91._12_4_;
                          auVar126._12_4_ = fVar128 * auVar164._12_4_;
                          fVar129 = auVar91._16_4_;
                          auVar126._16_4_ = fVar129 * 0.0;
                          fVar130 = auVar91._20_4_;
                          auVar126._20_4_ = fVar130 * 0.0;
                          fVar131 = auVar91._24_4_;
                          auVar126._24_4_ = fVar131 * 0.0;
                          auVar126._28_4_ = 0;
                          auVar82 = vfmadd231ps_fma(auVar126,auVar90,ZEXT1632(auVar82));
                          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar89,ZEXT1632(auVar83));
                          auVar132._0_4_ = auVar105._0_4_ + auVar92._0_4_;
                          auVar132._4_4_ = auVar105._4_4_ + auVar92._4_4_;
                          auVar132._8_4_ = auVar105._8_4_ + auVar92._8_4_;
                          auVar132._12_4_ = auVar105._12_4_ + auVar92._12_4_;
                          auVar132._16_4_ = auVar105._16_4_ + auVar92._16_4_;
                          auVar132._20_4_ = auVar105._20_4_ + auVar92._20_4_;
                          auVar132._24_4_ = auVar105._24_4_ + auVar92._24_4_;
                          auVar132._28_4_ = auVar105._28_4_ + auVar92._28_4_;
                          auVar136._0_4_ = auVar94._0_4_ + auVar110._0_4_;
                          auVar136._4_4_ = auVar94._4_4_ + auVar110._4_4_;
                          auVar136._8_4_ = auVar94._8_4_ + auVar110._8_4_;
                          auVar136._12_4_ = auVar94._12_4_ + auVar110._12_4_;
                          auVar136._16_4_ = auVar94._16_4_ + auVar110._16_4_;
                          auVar136._20_4_ = auVar94._20_4_ + auVar110._20_4_;
                          auVar136._24_4_ = auVar94._24_4_ + auVar110._24_4_;
                          auVar136._28_4_ = auVar94._28_4_ + auVar110._28_4_;
                          auVar93 = vaddps_avx512vl(auVar85,auVar95);
                          auVar102 = vmulps_avx512vl(auVar136,auVar101);
                          auVar102 = vfmsub231ps_avx512vl(auVar102,auVar100,auVar93);
                          auVar93 = vmulps_avx512vl(auVar93,auVar99);
                          auVar93 = vfmsub231ps_avx512vl(auVar93,auVar101,auVar132);
                          auVar103 = vmulps_avx512vl(auVar132,auVar100);
                          auVar103 = vfmsub231ps_avx512vl(auVar103,auVar99,auVar136);
                          auVar104 = vsubps_avx512vl(auVar105,auVar84);
                          auVar47._4_4_ = fVar203 * auVar103._4_4_;
                          auVar47._0_4_ = fVar201 * auVar103._0_4_;
                          auVar47._8_4_ = fVar125 * auVar103._8_4_;
                          auVar47._12_4_ = fVar128 * auVar103._12_4_;
                          auVar47._16_4_ = fVar129 * auVar103._16_4_;
                          auVar47._20_4_ = fVar130 * auVar103._20_4_;
                          auVar47._24_4_ = fVar131 * auVar103._24_4_;
                          auVar47._28_4_ = auVar103._28_4_;
                          auVar93 = vfmadd231ps_avx512vl(auVar47,auVar90,auVar93);
                          auVar103 = vsubps_avx512vl(auVar94,auVar87);
                          auVar83 = vfmadd231ps_fma(auVar93,auVar89,auVar102);
                          in_ZMM6 = ZEXT1664(auVar83);
                          auVar93 = vsubps_avx512vl(auVar95,auVar88);
                          in_ZMM7 = ZEXT3264(auVar93);
                          auVar84 = vaddps_avx512vl(auVar105,auVar84);
                          auVar87 = vaddps_avx512vl(auVar94,auVar87);
                          auVar88 = vaddps_avx512vl(auVar95,auVar88);
                          auVar105 = vmulps_avx512vl(auVar87,auVar93);
                          auVar105 = vfmsub231ps_avx512vl(auVar105,auVar103,auVar88);
                          auVar88 = vmulps_avx512vl(auVar88,auVar104);
                          auVar88 = vfmsub231ps_avx512vl(auVar88,auVar93,auVar84);
                          auVar48._4_4_ = auVar84._4_4_ * auVar103._4_4_;
                          auVar48._0_4_ = auVar84._0_4_ * auVar103._0_4_;
                          auVar48._8_4_ = auVar84._8_4_ * auVar103._8_4_;
                          auVar48._12_4_ = auVar84._12_4_ * auVar103._12_4_;
                          auVar48._16_4_ = auVar84._16_4_ * auVar103._16_4_;
                          auVar48._20_4_ = auVar84._20_4_ * auVar103._20_4_;
                          auVar48._24_4_ = auVar84._24_4_ * auVar103._24_4_;
                          auVar48._28_4_ = auVar84._28_4_;
                          auVar164 = vfmsub231ps_fma(auVar48,auVar104,auVar87);
                          auVar84 = vmulps_avx512vl(ZEXT1632(auVar164),auVar91);
                          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar88);
                          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar89,auVar105);
                          auVar87 = vaddps_avx512vl(auVar84,ZEXT1632(CONCAT412(auVar82._12_4_ +
                                                                               auVar83._12_4_,
                                                                               CONCAT48(auVar82.
                                                  _8_4_ + auVar83._8_4_,
                                                  CONCAT44(auVar82._4_4_ + auVar83._4_4_,
                                                           auVar82._0_4_ + auVar83._0_4_)))));
                          in_ZMM14 = ZEXT3264(auVar87);
                          auVar95 = auVar234._0_32_;
                          vandps_avx512vl(auVar87,auVar95);
                          in_ZMM15 = ZEXT3264(auVar87);
                          auVar88 = vmulps_avx512vl(auVar87,auVar233._0_32_);
                          auVar105 = vminps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar83));
                          auVar105 = vminps_avx512vl(auVar105,auVar84);
                          auVar94 = vxorps_avx512vl(auVar88,auVar232._0_32_);
                          uVar16 = vcmpps_avx512vl(auVar105,auVar94,5);
                          auVar105 = vmaxps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar83));
                          auVar84 = vmaxps_avx512vl(auVar105,auVar84);
                          uVar17 = vcmpps_avx512vl(auVar84,auVar88,2);
                          bVar68 = ((byte)uVar16 | (byte)uVar17) & bVar73;
                          if (bVar68 == 0) {
LAB_007b07b9:
                            auVar156 = ZEXT3264(auVar110);
                            in_ZMM11 = ZEXT3264(local_2a60);
                            in_ZMM12 = ZEXT3264(local_2a00);
                            in_ZMM13 = ZEXT3264(local_2a20);
                          }
                          else {
                            auVar84 = vmulps_avx512vl(auVar100,auVar98);
                            auVar88 = vmulps_avx512vl(auVar96,auVar101);
                            auVar105 = vmulps_avx512vl(auVar99,auVar97);
                            auVar94 = vmulps_avx512vl(auVar103,auVar101);
                            auVar102 = vmulps_avx512vl(auVar99,auVar93);
                            auVar106 = vmulps_avx512vl(auVar104,auVar100);
                            auVar97 = vfmsub213ps_avx512vl(auVar97,auVar101,auVar84);
                            auVar98 = vfmsub213ps_avx512vl(auVar98,auVar99,auVar88);
                            auVar96 = vfmsub213ps_avx512vl(auVar96,auVar100,auVar105);
                            auVar93 = vfmsub213ps_avx512vl(auVar93,auVar100,auVar94);
                            auVar100 = vfmsub213ps_avx512vl(auVar104,auVar101,auVar102);
                            auVar99 = vfmsub213ps_avx512vl(auVar103,auVar99,auVar106);
                            vandps_avx512vl(auVar84,auVar95);
                            vandps_avx512vl(auVar94,auVar95);
                            uVar66 = vcmpps_avx512vl(auVar99,auVar99,1);
                            vandps_avx512vl(auVar88,auVar95);
                            vandps_avx512vl(auVar102,auVar95);
                            uVar72 = vcmpps_avx512vl(auVar99,auVar99,1);
                            vandps_avx512vl(auVar105,auVar95);
                            vandps_avx512vl(auVar106,auVar95);
                            auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar232 = ZEXT3264(auVar84);
                            uVar78 = vcmpps_avx512vl(auVar99,auVar99,1);
                            bVar76 = (bool)((byte)uVar66 & 1);
                            auVar80._0_4_ =
                                 (uint)bVar76 * auVar97._0_4_ | (uint)!bVar76 * auVar93._0_4_;
                            bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
                            auVar80._4_4_ =
                                 (uint)bVar76 * auVar97._4_4_ | (uint)!bVar76 * auVar93._4_4_;
                            bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
                            auVar80._8_4_ =
                                 (uint)bVar76 * auVar97._8_4_ | (uint)!bVar76 * auVar93._8_4_;
                            bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
                            auVar80._12_4_ =
                                 (uint)bVar76 * auVar97._12_4_ | (uint)!bVar76 * auVar93._12_4_;
                            bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
                            auVar107._16_4_ =
                                 (uint)bVar76 * auVar97._16_4_ | (uint)!bVar76 * auVar93._16_4_;
                            auVar107._0_16_ = auVar80;
                            bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
                            auVar107._20_4_ =
                                 (uint)bVar76 * auVar97._20_4_ | (uint)!bVar76 * auVar93._20_4_;
                            bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
                            auVar107._24_4_ =
                                 (uint)bVar76 * auVar97._24_4_ | (uint)!bVar76 * auVar93._24_4_;
                            bVar76 = SUB81(uVar66 >> 7,0);
                            auVar107._28_4_ =
                                 (uint)bVar76 * auVar97._28_4_ | (uint)!bVar76 * auVar93._28_4_;
                            in_ZMM7 = ZEXT3264(auVar107);
                            bVar76 = (bool)((byte)uVar72 & 1);
                            auVar108._0_4_ =
                                 (uint)bVar76 * auVar98._0_4_ | (uint)!bVar76 * auVar100._0_4_;
                            bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
                            auVar108._4_4_ =
                                 (uint)bVar76 * auVar98._4_4_ | (uint)!bVar76 * auVar100._4_4_;
                            bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
                            auVar108._8_4_ =
                                 (uint)bVar76 * auVar98._8_4_ | (uint)!bVar76 * auVar100._8_4_;
                            bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
                            auVar108._12_4_ =
                                 (uint)bVar76 * auVar98._12_4_ | (uint)!bVar76 * auVar100._12_4_;
                            bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
                            auVar108._16_4_ =
                                 (uint)bVar76 * auVar98._16_4_ | (uint)!bVar76 * auVar100._16_4_;
                            bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
                            auVar108._20_4_ =
                                 (uint)bVar76 * auVar98._20_4_ | (uint)!bVar76 * auVar100._20_4_;
                            bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
                            auVar108._24_4_ =
                                 (uint)bVar76 * auVar98._24_4_ | (uint)!bVar76 * auVar100._24_4_;
                            bVar76 = SUB81(uVar72 >> 7,0);
                            auVar108._28_4_ =
                                 (uint)bVar76 * auVar98._28_4_ | (uint)!bVar76 * auVar100._28_4_;
                            bVar76 = (bool)((byte)uVar78 & 1);
                            auVar109._0_4_ =
                                 (float)((uint)bVar76 * auVar96._0_4_ |
                                        (uint)!bVar76 * auVar99._0_4_);
                            bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
                            auVar109._4_4_ =
                                 (float)((uint)bVar76 * auVar96._4_4_ |
                                        (uint)!bVar76 * auVar99._4_4_);
                            bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
                            auVar109._8_4_ =
                                 (float)((uint)bVar76 * auVar96._8_4_ |
                                        (uint)!bVar76 * auVar99._8_4_);
                            bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
                            auVar109._12_4_ =
                                 (float)((uint)bVar76 * auVar96._12_4_ |
                                        (uint)!bVar76 * auVar99._12_4_);
                            bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
                            auVar109._16_4_ =
                                 (float)((uint)bVar76 * auVar96._16_4_ |
                                        (uint)!bVar76 * auVar99._16_4_);
                            bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
                            auVar109._20_4_ =
                                 (float)((uint)bVar76 * auVar96._20_4_ |
                                        (uint)!bVar76 * auVar99._20_4_);
                            bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
                            auVar109._24_4_ =
                                 (float)((uint)bVar76 * auVar96._24_4_ |
                                        (uint)!bVar76 * auVar99._24_4_);
                            bVar76 = SUB81(uVar78 >> 7,0);
                            auVar109._28_4_ =
                                 (uint)bVar76 * auVar96._28_4_ | (uint)!bVar76 * auVar99._28_4_;
                            auVar49._4_4_ = fVar203 * auVar109._4_4_;
                            auVar49._0_4_ = fVar201 * auVar109._0_4_;
                            auVar49._8_4_ = fVar125 * auVar109._8_4_;
                            auVar49._12_4_ = fVar128 * auVar109._12_4_;
                            auVar49._16_4_ = fVar129 * auVar109._16_4_;
                            auVar49._20_4_ = fVar130 * auVar109._20_4_;
                            auVar49._24_4_ = fVar131 * auVar109._24_4_;
                            auVar49._28_4_ = auVar91._28_4_;
                            auVar164 = vfmadd213ps_fma(auVar90,auVar108,auVar49);
                            auVar164 = vfmadd213ps_fma(auVar89,auVar107,ZEXT1632(auVar164));
                            auVar89 = ZEXT1632(CONCAT412(auVar164._12_4_ + auVar164._12_4_,
                                                         CONCAT48(auVar164._8_4_ + auVar164._8_4_,
                                                                  CONCAT44(auVar164._4_4_ +
                                                                           auVar164._4_4_,
                                                                           auVar164._0_4_ +
                                                                           auVar164._0_4_))));
                            auVar166 = ZEXT3264(auVar89);
                            auVar192._0_4_ = auVar85._0_4_ * auVar109._0_4_;
                            auVar192._4_4_ = auVar85._4_4_ * auVar109._4_4_;
                            auVar192._8_4_ = auVar85._8_4_ * auVar109._8_4_;
                            auVar192._12_4_ = auVar85._12_4_ * auVar109._12_4_;
                            auVar192._16_4_ = auVar85._16_4_ * auVar109._16_4_;
                            auVar192._20_4_ = auVar85._20_4_ * auVar109._20_4_;
                            auVar192._24_4_ = auVar85._24_4_ * auVar109._24_4_;
                            auVar192._28_4_ = 0;
                            auVar164 = vfmadd213ps_fma(auVar110,auVar108,auVar192);
                            auVar81 = vfmadd213ps_fma(auVar92,auVar107,ZEXT1632(auVar164));
                            auVar110 = vrcp14ps_avx512vl(auVar89);
                            auVar88 = vxorps_avx512vl(auVar89,auVar84);
                            in_ZMM8 = ZEXT3264(auVar88);
                            auVar84 = vfnmadd213ps_avx512vl(auVar110,auVar89,auVar86);
                            auVar164 = vfmadd132ps_fma(auVar84,auVar110,auVar110);
                            in_ZMM9 = ZEXT1664(auVar164);
                            auVar84 = *(undefined1 (*) [32])(ray + 0x100);
                            in_ZMM10 = ZEXT3264(auVar84);
                            auVar85 = ZEXT1632(CONCAT412(auVar164._12_4_ *
                                                         (auVar81._12_4_ + auVar81._12_4_),
                                                         CONCAT48(auVar164._8_4_ *
                                                                  (auVar81._8_4_ + auVar81._8_4_),
                                                                  CONCAT44(auVar164._4_4_ *
                                                                           (auVar81._4_4_ +
                                                                           auVar81._4_4_),
                                                                           auVar164._0_4_ *
                                                                           (auVar81._0_4_ +
                                                                           auVar81._0_4_)))));
                            uVar16 = vcmpps_avx512vl(auVar85,auVar84,2);
                            uVar17 = vcmpps_avx512vl(auVar85,*(undefined1 (*) [32])(ray + 0x60),0xd)
                            ;
                            uVar18 = vcmpps_avx512vl(auVar89,auVar88,4);
                            bVar68 = bVar68 & (byte)uVar16 & (byte)uVar17 & (byte)uVar18;
                            if (bVar68 == 0) goto LAB_007b07b9;
                            uVar74 = pGVar2->mask;
                            auVar154._4_4_ = uVar74;
                            auVar154._0_4_ = uVar74;
                            auVar154._8_4_ = uVar74;
                            auVar154._12_4_ = uVar74;
                            auVar154._16_4_ = uVar74;
                            auVar154._20_4_ = uVar74;
                            auVar154._24_4_ = uVar74;
                            auVar154._28_4_ = uVar74;
                            auVar156 = ZEXT3264(auVar154);
                            uVar16 = vptestmd_avx512vl(auVar154,*(undefined1 (*) [32])(ray + 0x120))
                            ;
                            bVar68 = bVar68 & (byte)uVar16;
                            uVar66 = (ulong)bVar68;
                            in_ZMM11 = ZEXT3264(local_2a60);
                            in_ZMM12 = ZEXT3264(local_2a00);
                            in_ZMM13 = ZEXT3264(local_2a20);
                            if (bVar68 != 0) {
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                uVar66 = vcmpps_avx512vl(auVar87,auVar235._0_32_,5);
                                auVar89 = vrcp14ps_avx512vl(auVar87);
                                auVar90 = vfnmadd213ps_avx512vl(auVar87,auVar89,auVar86);
                                auVar90 = vfmadd132ps_avx512vl(auVar90,auVar89,auVar89);
                                fVar201 = (float)((uint)((byte)uVar66 & 1) * auVar90._0_4_);
                                fVar203 = (float)((uint)((byte)(uVar66 >> 1) & 1) * auVar90._4_4_);
                                auVar81._4_4_ = fVar203;
                                auVar81._0_4_ = fVar201;
                                fVar125 = (float)((uint)((byte)(uVar66 >> 2) & 1) * auVar90._8_4_);
                                auVar81._8_4_ = fVar125;
                                fVar128 = (float)((uint)((byte)(uVar66 >> 3) & 1) * auVar90._12_4_);
                                auVar81._12_4_ = fVar128;
                                fVar129 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar90._16_4_);
                                fVar130 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar90._20_4_);
                                fVar131 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar90._24_4_);
                                in_ZMM14 = ZEXT3264(CONCAT428((uint)(byte)(uVar66 >> 7) *
                                                              auVar90._28_4_,
                                                              CONCAT424(fVar131,CONCAT420(fVar130,
                                                  CONCAT416(fVar129,auVar81)))));
                                auVar127._0_4_ = fVar201 * auVar82._0_4_;
                                auVar127._4_4_ = fVar203 * auVar82._4_4_;
                                auVar127._8_4_ = fVar125 * auVar82._8_4_;
                                auVar127._12_4_ = fVar128 * auVar82._12_4_;
                                auVar127._16_4_ = fVar129 * 0.0;
                                auVar127._20_4_ = fVar130 * 0.0;
                                auVar127._24_4_ = fVar131 * 0.0;
                                auVar127._28_4_ = 0;
                                local_2980 = vminps_avx512vl(auVar127,auVar86);
                                auVar54._4_4_ = fVar203 * auVar83._4_4_;
                                auVar54._0_4_ = fVar201 * auVar83._0_4_;
                                auVar54._8_4_ = fVar125 * auVar83._8_4_;
                                auVar54._12_4_ = fVar128 * auVar83._12_4_;
                                auVar54._16_4_ = fVar129 * 0.0;
                                auVar54._20_4_ = fVar130 * 0.0;
                                auVar54._24_4_ = fVar131 * 0.0;
                                auVar54._28_4_ = auVar89._28_4_;
                                local_2960 = vminps_avx512vl(auVar54,auVar86);
                                auVar156 = ZEXT3264(local_2960);
                                pRVar5 = context->user;
                                local_2920 = vpbroadcastd_avx512vl();
                                auVar166 = ZEXT3264(local_2920);
                                local_2940 = vpbroadcastd_avx512vl();
                                in_ZMM6 = ZEXT3264(local_2940);
                                _local_29e0 = auVar107;
                                _local_29c0 = auVar108;
                                _local_29a0 = auVar109;
                                auVar86 = vpcmpeqd_avx2(local_2980,local_2980);
                                local_2a38[1] = auVar86;
                                *local_2a38 = auVar86;
                                local_2900 = pRVar5->instID[0];
                                uStack_28fc = local_2900;
                                uStack_28f8 = local_2900;
                                uStack_28f4 = local_2900;
                                uStack_28f0 = local_2900;
                                uStack_28ec = local_2900;
                                uStack_28e8 = local_2900;
                                uStack_28e4 = local_2900;
                                local_28e0 = pRVar5->instPrimID[0];
                                uStack_28dc = local_28e0;
                                uStack_28d8 = local_28e0;
                                uStack_28d4 = local_28e0;
                                uStack_28d0 = local_28e0;
                                uStack_28cc = local_28e0;
                                uStack_28c8 = local_28e0;
                                uStack_28c4 = local_28e0;
                                auVar85 = vblendmps_avx512vl(auVar84,auVar85);
                                bVar76 = (bool)(bVar68 >> 1 & 1);
                                bVar7 = (bool)(bVar68 >> 2 & 1);
                                bVar8 = (bool)(bVar68 >> 3 & 1);
                                bVar9 = (bool)(bVar68 >> 4 & 1);
                                bVar10 = (bool)(bVar68 >> 5 & 1);
                                bVar11 = (bool)(bVar68 >> 6 & 1);
                                *(uint *)(ray + 0x100) =
                                     (uint)(bVar68 & 1) * auVar85._0_4_ |
                                     !(bool)(bVar68 & 1) * local_28e0;
                                *(uint *)(ray + 0x104) =
                                     (uint)bVar76 * auVar85._4_4_ | !bVar76 * local_28e0;
                                *(uint *)(ray + 0x108) =
                                     (uint)bVar7 * auVar85._8_4_ | !bVar7 * local_28e0;
                                *(uint *)(ray + 0x10c) =
                                     (uint)bVar8 * auVar85._12_4_ | !bVar8 * local_28e0;
                                *(uint *)(ray + 0x110) =
                                     (uint)bVar9 * auVar85._16_4_ | !bVar9 * local_28e0;
                                *(uint *)(ray + 0x114) =
                                     (uint)bVar10 * auVar85._20_4_ | !bVar10 * local_28e0;
                                *(uint *)(ray + 0x118) =
                                     (uint)bVar11 * auVar85._24_4_ | !bVar11 * local_28e0;
                                *(uint *)(ray + 0x11c) =
                                     (uint)(bVar68 >> 7) * auVar85._28_4_ |
                                     !(bool)(bVar68 >> 7) * local_28e0;
                                local_2ae0 = vpmovm2d_avx512vl((ulong)bVar68);
                                local_2ac0._0_4_ = SUB84(local_2ae0,0);
                                local_2ac0._4_4_ = (undefined4)((ulong)local_2ae0 >> 0x20);
                                fStack_2ab8 = SUB84(pGVar2->userPtr,0);
                                fStack_2ab4 = (float)((ulong)pGVar2->userPtr >> 0x20);
                                fStack_2ab0 = SUB84(context->user,0);
                                fStack_2aac = (float)((ulong)context->user >> 0x20);
                                local_2aa0._0_4_ = SUB84((RTCHitN *)local_29e0,0);
                                local_2aa0._4_4_ = (float)((ulong)local_29e0 >> 0x20);
                                fStack_2a98 = 1.12104e-44;
                                local_28c0 = auVar84;
                                local_2ac0 = (undefined1  [8])local_2ae0;
                                local_2aa0 = (RTCHitN *)local_29e0;
                                uStack_2aa8 = ray;
                                if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                  auVar156 = ZEXT1664(local_2960._0_16_);
                                  auVar166 = ZEXT1664(local_2920._0_16_);
                                  in_ZMM6 = ZEXT1664(local_2940._0_16_);
                                  in_ZMM7 = ZEXT1664(auVar80);
                                  in_ZMM8 = ZEXT1664(auVar88._0_16_);
                                  in_ZMM9 = ZEXT1664(auVar164);
                                  in_ZMM14 = ZEXT1664(auVar81);
                                  in_ZMM15 = ZEXT1664(auVar87._0_16_);
                                  (*pGVar2->occlusionFilterN)
                                            ((RTCFilterFunctionNArguments *)local_2ac0);
                                  in_ZMM13 = ZEXT3264(local_2a20);
                                  in_ZMM12 = ZEXT3264(local_2a00);
                                  in_ZMM11 = ZEXT3264(local_2a60);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar232 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                  auVar233 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                  auVar239 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar238 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar237 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar236 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                  auVar235 = ZEXT3264(auVar84);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar234 = ZEXT3264(auVar84);
                                }
                                uVar66 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                                if ((char)uVar66 != '\0') {
                                  p_Var6 = context->args->filter;
                                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                    auVar156 = ZEXT1664(auVar156._0_16_);
                                    auVar166 = ZEXT1664(auVar166._0_16_);
                                    in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
                                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                    in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                    in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                    (*p_Var6)((RTCFilterFunctionNArguments *)local_2ac0);
                                    in_ZMM13 = ZEXT3264(local_2a20);
                                    in_ZMM12 = ZEXT3264(local_2a00);
                                    in_ZMM11 = ZEXT3264(local_2a60);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar232 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                    auVar233 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                    auVar239 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar238 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar237 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar236 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                    auVar235 = ZEXT3264(auVar84);
                                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar234 = ZEXT3264(auVar84);
                                  }
                                  uVar66 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                                  auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  bVar76 = (bool)((byte)uVar66 & 1);
                                  auVar115._0_4_ =
                                       (uint)bVar76 * auVar84._0_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x100);
                                  bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
                                  auVar115._4_4_ =
                                       (uint)bVar76 * auVar84._4_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x104);
                                  bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
                                  auVar115._8_4_ =
                                       (uint)bVar76 * auVar84._8_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x108);
                                  bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
                                  auVar115._12_4_ =
                                       (uint)bVar76 * auVar84._12_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x10c);
                                  bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
                                  auVar115._16_4_ =
                                       (uint)bVar76 * auVar84._16_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x110);
                                  bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
                                  auVar115._20_4_ =
                                       (uint)bVar76 * auVar84._20_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x114);
                                  bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
                                  auVar115._24_4_ =
                                       (uint)bVar76 * auVar84._24_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x118);
                                  bVar76 = SUB81(uVar66 >> 7,0);
                                  auVar115._28_4_ =
                                       (uint)bVar76 * auVar84._28_4_ |
                                       (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x11c);
                                  *(undefined1 (*) [32])(uStack_2aa8 + 0x100) = auVar115;
                                }
                                bVar76 = (bool)((byte)uVar66 & 1);
                                auVar117._0_4_ =
                                     (uint)bVar76 * *(int *)local_2af0 |
                                     (uint)!bVar76 * local_28c0._0_4_;
                                bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
                                auVar117._4_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 4) |
                                     (uint)!bVar76 * local_28c0._4_4_;
                                bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
                                auVar117._8_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 8) |
                                     (uint)!bVar76 * local_28c0._8_4_;
                                bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
                                auVar117._12_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 0xc) |
                                     (uint)!bVar76 * local_28c0._12_4_;
                                bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
                                auVar117._16_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 0x10) |
                                     (uint)!bVar76 * local_28c0._16_4_;
                                bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
                                auVar117._20_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 0x14) |
                                     (uint)!bVar76 * local_28c0._20_4_;
                                bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
                                auVar117._24_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 0x18) |
                                     (uint)!bVar76 * local_28c0._24_4_;
                                bVar76 = SUB81(uVar66 >> 7,0);
                                auVar117._28_4_ =
                                     (uint)bVar76 * *(int *)(local_2af0 + 0x1c) |
                                     (uint)!bVar76 * local_28c0._28_4_;
                                in_ZMM10 = ZEXT3264(auVar117);
                                *(undefined1 (*) [32])local_2af0 = auVar117;
                              }
                              bVar73 = bVar73 & ~(byte)uVar66;
                            }
                          }
                          if (bVar73 == 0) {
                            bVar76 = false;
                            auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                            auVar230 = ZEXT3264(auVar84);
                          }
                          else {
                            auVar84 = *(undefined1 (*) [32])ray;
                            auVar85 = *(undefined1 (*) [32])(ray + 0x20);
                            auVar86 = *(undefined1 (*) [32])(ray + 0x40);
                            auVar87 = *(undefined1 (*) [32])(ray + 0x80);
                            in_ZMM7 = ZEXT3264(auVar87);
                            auVar88 = *(undefined1 (*) [32])(ray + 0xa0);
                            in_ZMM8 = ZEXT3264(auVar88);
                            auVar89 = *(undefined1 (*) [32])(ray + 0xc0);
                            in_ZMM10 = ZEXT3264(auVar89);
                            auVar90 = vsubps_avx(local_2860,auVar84);
                            auVar166 = ZEXT3264(auVar90);
                            auVar91 = vsubps_avx(local_2880,auVar85);
                            in_ZMM6 = ZEXT3264(auVar91);
                            auVar92 = vsubps_avx(local_28a0,auVar86);
                            in_ZMM9 = ZEXT3264(auVar92);
                            auVar93 = vsubps_avx(in_ZMM11._0_32_,auVar84);
                            auVar110 = vsubps_avx(in_ZMM12._0_32_,auVar85);
                            auVar105 = vsubps_avx512vl(in_ZMM13._0_32_,auVar86);
                            auVar84 = vsubps_avx512vl(local_2640,auVar84);
                            auVar85 = vsubps_avx512vl(local_2660,auVar85);
                            auVar86 = vsubps_avx512vl(local_2680,auVar86);
                            auVar94 = vsubps_avx512vl(auVar84,auVar90);
                            in_ZMM12 = ZEXT3264(auVar94);
                            auVar95 = vsubps_avx512vl(auVar85,auVar91);
                            in_ZMM14 = ZEXT3264(auVar95);
                            auVar96 = vsubps_avx512vl(auVar86,auVar92);
                            in_ZMM13 = ZEXT3264(auVar96);
                            auVar97 = vsubps_avx512vl(auVar90,auVar93);
                            auVar98 = vsubps_avx512vl(auVar91,auVar110);
                            auVar99 = vsubps_avx512vl(auVar92,auVar105);
                            auVar100 = vsubps_avx512vl(auVar93,auVar84);
                            auVar101 = vsubps_avx512vl(auVar110,auVar85);
                            auVar102 = vsubps_avx512vl(auVar105,auVar86);
                            auVar103 = vaddps_avx512vl(auVar84,auVar90);
                            auVar104 = vaddps_avx512vl(auVar85,auVar91);
                            auVar106 = vaddps_avx512vl(auVar86,auVar92);
                            auVar111 = vmulps_avx512vl(auVar104,auVar96);
                            auVar111 = vfmsub231ps_avx512vl(auVar111,auVar95,auVar106);
                            auVar106 = vmulps_avx512vl(auVar106,auVar94);
                            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar96,auVar103);
                            auVar50._4_4_ = auVar95._4_4_ * auVar103._4_4_;
                            auVar50._0_4_ = auVar95._0_4_ * auVar103._0_4_;
                            auVar50._8_4_ = auVar95._8_4_ * auVar103._8_4_;
                            auVar50._12_4_ = auVar95._12_4_ * auVar103._12_4_;
                            auVar50._16_4_ = auVar95._16_4_ * auVar103._16_4_;
                            auVar50._20_4_ = auVar95._20_4_ * auVar103._20_4_;
                            auVar50._24_4_ = auVar95._24_4_ * auVar103._24_4_;
                            auVar50._28_4_ = auVar103._28_4_;
                            auVar82 = vfmsub231ps_fma(auVar50,auVar94,auVar104);
                            fVar201 = auVar89._0_4_;
                            auVar145._0_4_ = fVar201 * auVar82._0_4_;
                            fVar203 = auVar89._4_4_;
                            auVar145._4_4_ = fVar203 * auVar82._4_4_;
                            fVar125 = auVar89._8_4_;
                            auVar145._8_4_ = fVar125 * auVar82._8_4_;
                            fVar128 = auVar89._12_4_;
                            auVar145._12_4_ = fVar128 * auVar82._12_4_;
                            fVar129 = auVar89._16_4_;
                            auVar145._16_4_ = fVar129 * 0.0;
                            fVar130 = auVar89._20_4_;
                            auVar145._20_4_ = fVar130 * 0.0;
                            fVar131 = auVar89._24_4_;
                            auVar145._24_4_ = fVar131 * 0.0;
                            auVar145._28_4_ = 0;
                            auVar103 = vfmadd231ps_avx512vl(auVar145,auVar88,auVar106);
                            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar87,auVar111);
                            auVar155._0_4_ = auVar93._0_4_ + auVar90._0_4_;
                            auVar155._4_4_ = auVar93._4_4_ + auVar90._4_4_;
                            auVar155._8_4_ = auVar93._8_4_ + auVar90._8_4_;
                            auVar155._12_4_ = auVar93._12_4_ + auVar90._12_4_;
                            auVar155._16_4_ = auVar93._16_4_ + auVar90._16_4_;
                            auVar155._20_4_ = auVar93._20_4_ + auVar90._20_4_;
                            auVar155._24_4_ = auVar93._24_4_ + auVar90._24_4_;
                            auVar155._28_4_ = auVar93._28_4_ + auVar90._28_4_;
                            auVar104 = vaddps_avx512vl(auVar91,auVar110);
                            auVar106 = vaddps_avx512vl(auVar92,auVar105);
                            auVar111 = vmulps_avx512vl(auVar104,auVar99);
                            auVar111 = vfmsub231ps_avx512vl(auVar111,auVar98,auVar106);
                            auVar106 = vmulps_avx512vl(auVar106,auVar97);
                            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar99,auVar155);
                            auVar112 = vmulps_avx512vl(auVar155,auVar98);
                            auVar104 = vfmsub231ps_avx512vl(auVar112,auVar97,auVar104);
                            auVar51._4_4_ = fVar203 * auVar104._4_4_;
                            auVar51._0_4_ = fVar201 * auVar104._0_4_;
                            auVar51._8_4_ = fVar125 * auVar104._8_4_;
                            auVar51._12_4_ = fVar128 * auVar104._12_4_;
                            auVar51._16_4_ = fVar129 * auVar104._16_4_;
                            auVar51._20_4_ = fVar130 * auVar104._20_4_;
                            auVar51._24_4_ = fVar131 * auVar104._24_4_;
                            auVar51._28_4_ = auVar104._28_4_;
                            auVar104 = vfmadd231ps_avx512vl(auVar51,auVar88,auVar106);
                            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar232 = ZEXT3264(auVar106);
                            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar87,auVar111);
                            auVar156 = ZEXT3264(auVar104);
                            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                            auVar233 = ZEXT3264(auVar111);
                            auVar84 = vaddps_avx512vl(auVar93,auVar84);
                            auVar85 = vaddps_avx512vl(auVar110,auVar85);
                            auVar86 = vaddps_avx512vl(auVar105,auVar86);
                            auVar93 = vmulps_avx512vl(auVar85,auVar102);
                            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar101,auVar86);
                            auVar86 = vmulps_avx512vl(auVar86,auVar100);
                            auVar86 = vfmsub231ps_avx512vl(auVar86,auVar102,auVar84);
                            auVar52._4_4_ = auVar84._4_4_ * auVar101._4_4_;
                            auVar52._0_4_ = auVar84._0_4_ * auVar101._0_4_;
                            auVar52._8_4_ = auVar84._8_4_ * auVar101._8_4_;
                            auVar52._12_4_ = auVar84._12_4_ * auVar101._12_4_;
                            auVar52._16_4_ = auVar84._16_4_ * auVar101._16_4_;
                            auVar52._20_4_ = auVar84._20_4_ * auVar101._20_4_;
                            auVar52._24_4_ = auVar84._24_4_ * auVar101._24_4_;
                            auVar52._28_4_ = auVar84._28_4_;
                            auVar82 = vfmsub231ps_fma(auVar52,auVar100,auVar85);
                            auVar84 = vmulps_avx512vl(ZEXT1632(auVar82),auVar89);
                            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar86);
                            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar93);
                            auVar211._0_4_ = auVar103._0_4_ + auVar104._0_4_;
                            auVar211._4_4_ = auVar103._4_4_ + auVar104._4_4_;
                            auVar211._8_4_ = auVar103._8_4_ + auVar104._8_4_;
                            auVar211._12_4_ = auVar103._12_4_ + auVar104._12_4_;
                            auVar211._16_4_ = auVar103._16_4_ + auVar104._16_4_;
                            auVar211._20_4_ = auVar103._20_4_ + auVar104._20_4_;
                            auVar211._24_4_ = auVar103._24_4_ + auVar104._24_4_;
                            auVar211._28_4_ = auVar103._28_4_ + auVar104._28_4_;
                            auVar85 = vaddps_avx512vl(auVar84,auVar211);
                            in_ZMM11 = ZEXT3264(auVar85);
                            auVar105 = auVar234._0_32_;
                            vandps_avx512vl(auVar85,auVar105);
                            in_ZMM15 = ZEXT3264(auVar85);
                            auVar86 = vmulps_avx512vl(auVar85,auVar111);
                            auVar93 = vminps_avx512vl(auVar103,auVar104);
                            auVar93 = vminps_avx512vl(auVar93,auVar84);
                            auVar110 = vxorps_avx512vl(auVar86,auVar106);
                            uVar16 = vcmpps_avx512vl(auVar93,auVar110,5);
                            auVar93 = vmaxps_avx512vl(auVar103,auVar104);
                            auVar84 = vmaxps_avx512vl(auVar93,auVar84);
                            uVar17 = vcmpps_avx512vl(auVar84,auVar86,2);
                            bVar68 = ((byte)uVar16 | (byte)uVar17) & bVar73;
                            if (bVar68 == 0) {
                              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                              auVar230 = ZEXT3264(auVar84);
                            }
                            else {
                              auVar84 = vmulps_avx512vl(auVar98,auVar96);
                              auVar86 = vmulps_avx512vl(auVar94,auVar99);
                              auVar93 = vmulps_avx512vl(auVar97,auVar95);
                              auVar110 = vmulps_avx512vl(auVar101,auVar99);
                              auVar106 = vmulps_avx512vl(auVar97,auVar102);
                              auVar111 = vmulps_avx512vl(auVar100,auVar98);
                              auVar95 = vfmsub213ps_avx512vl(auVar95,auVar99,auVar84);
                              in_ZMM14 = ZEXT3264(auVar95);
                              auVar96 = vfmsub213ps_avx512vl(auVar96,auVar97,auVar86);
                              in_ZMM13 = ZEXT3264(auVar96);
                              auVar94 = vfmsub213ps_avx512vl(auVar94,auVar98,auVar93);
                              in_ZMM12 = ZEXT3264(auVar94);
                              auVar98 = vfmsub213ps_avx512vl(auVar102,auVar98,auVar110);
                              auVar99 = vfmsub213ps_avx512vl(auVar100,auVar99,auVar106);
                              auVar97 = vfmsub213ps_avx512vl(auVar101,auVar97,auVar111);
                              vandps_avx512vl(auVar84,auVar105);
                              vandps_avx512vl(auVar110,auVar105);
                              uVar66 = vcmpps_avx512vl(auVar97,auVar97,1);
                              vandps_avx512vl(auVar86,auVar105);
                              vandps_avx512vl(auVar106,auVar105);
                              uVar72 = vcmpps_avx512vl(auVar97,auVar97,1);
                              vandps_avx512vl(auVar93,auVar105);
                              vandps_avx512vl(auVar111,auVar105);
                              auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar232 = ZEXT3264(auVar84);
                              uVar78 = vcmpps_avx512vl(auVar97,auVar97,1);
                              bVar76 = (bool)((byte)uVar66 & 1);
                              auVar113._0_4_ =
                                   (uint)bVar76 * auVar95._0_4_ | (uint)!bVar76 * auVar98._0_4_;
                              bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
                              auVar113._4_4_ =
                                   (uint)bVar76 * auVar95._4_4_ | (uint)!bVar76 * auVar98._4_4_;
                              bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
                              auVar113._8_4_ =
                                   (uint)bVar76 * auVar95._8_4_ | (uint)!bVar76 * auVar98._8_4_;
                              bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
                              auVar113._12_4_ =
                                   (uint)bVar76 * auVar95._12_4_ | (uint)!bVar76 * auVar98._12_4_;
                              bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
                              auVar113._16_4_ =
                                   (uint)bVar76 * auVar95._16_4_ | (uint)!bVar76 * auVar98._16_4_;
                              bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
                              auVar113._20_4_ =
                                   (uint)bVar76 * auVar95._20_4_ | (uint)!bVar76 * auVar98._20_4_;
                              bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
                              auVar113._24_4_ =
                                   (uint)bVar76 * auVar95._24_4_ | (uint)!bVar76 * auVar98._24_4_;
                              bVar76 = SUB81(uVar66 >> 7,0);
                              auVar113._28_4_ =
                                   (uint)bVar76 * auVar95._28_4_ | (uint)!bVar76 * auVar98._28_4_;
                              bVar76 = (bool)((byte)uVar72 & 1);
                              auVar114._0_4_ =
                                   (uint)bVar76 * auVar96._0_4_ | (uint)!bVar76 * auVar99._0_4_;
                              bVar76 = (bool)((byte)(uVar72 >> 1) & 1);
                              auVar114._4_4_ =
                                   (uint)bVar76 * auVar96._4_4_ | (uint)!bVar76 * auVar99._4_4_;
                              bVar76 = (bool)((byte)(uVar72 >> 2) & 1);
                              auVar114._8_4_ =
                                   (uint)bVar76 * auVar96._8_4_ | (uint)!bVar76 * auVar99._8_4_;
                              bVar76 = (bool)((byte)(uVar72 >> 3) & 1);
                              auVar114._12_4_ =
                                   (uint)bVar76 * auVar96._12_4_ | (uint)!bVar76 * auVar99._12_4_;
                              bVar76 = (bool)((byte)(uVar72 >> 4) & 1);
                              auVar114._16_4_ =
                                   (uint)bVar76 * auVar96._16_4_ | (uint)!bVar76 * auVar99._16_4_;
                              bVar76 = (bool)((byte)(uVar72 >> 5) & 1);
                              auVar114._20_4_ =
                                   (uint)bVar76 * auVar96._20_4_ | (uint)!bVar76 * auVar99._20_4_;
                              bVar76 = (bool)((byte)(uVar72 >> 6) & 1);
                              auVar114._24_4_ =
                                   (uint)bVar76 * auVar96._24_4_ | (uint)!bVar76 * auVar99._24_4_;
                              bVar76 = SUB81(uVar72 >> 7,0);
                              auVar114._28_4_ =
                                   (uint)bVar76 * auVar96._28_4_ | (uint)!bVar76 * auVar99._28_4_;
                              bVar76 = (bool)((byte)uVar78 & 1);
                              fVar79 = (float)((uint)bVar76 * auVar94._0_4_ |
                                              (uint)!bVar76 * auVar97._0_4_);
                              bVar76 = (bool)((byte)(uVar78 >> 1) & 1);
                              fVar119 = (float)((uint)bVar76 * auVar94._4_4_ |
                                               (uint)!bVar76 * auVar97._4_4_);
                              bVar76 = (bool)((byte)(uVar78 >> 2) & 1);
                              fVar120 = (float)((uint)bVar76 * auVar94._8_4_ |
                                               (uint)!bVar76 * auVar97._8_4_);
                              bVar76 = (bool)((byte)(uVar78 >> 3) & 1);
                              fVar121 = (float)((uint)bVar76 * auVar94._12_4_ |
                                               (uint)!bVar76 * auVar97._12_4_);
                              bVar76 = (bool)((byte)(uVar78 >> 4) & 1);
                              fVar122 = (float)((uint)bVar76 * auVar94._16_4_ |
                                               (uint)!bVar76 * auVar97._16_4_);
                              bVar76 = (bool)((byte)(uVar78 >> 5) & 1);
                              fVar123 = (float)((uint)bVar76 * auVar94._20_4_ |
                                               (uint)!bVar76 * auVar97._20_4_);
                              bVar76 = (bool)((byte)(uVar78 >> 6) & 1);
                              fVar124 = (float)((uint)bVar76 * auVar94._24_4_ |
                                               (uint)!bVar76 * auVar97._24_4_);
                              bVar76 = SUB81(uVar78 >> 7,0);
                              auVar53._4_4_ = fVar203 * fVar119;
                              auVar53._0_4_ = fVar201 * fVar79;
                              auVar53._8_4_ = fVar125 * fVar120;
                              auVar53._12_4_ = fVar128 * fVar121;
                              auVar53._16_4_ = fVar129 * fVar122;
                              auVar53._20_4_ = fVar130 * fVar123;
                              auVar53._24_4_ = fVar131 * fVar124;
                              auVar53._28_4_ = auVar89._28_4_;
                              auVar82 = vfmadd213ps_fma(auVar88,auVar114,auVar53);
                              auVar82 = vfmadd213ps_fma(auVar87,auVar113,ZEXT1632(auVar82));
                              auVar88 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                           CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                    CONCAT44(auVar82._4_4_ +
                                                                             auVar82._4_4_,
                                                                             auVar82._0_4_ +
                                                                             auVar82._0_4_))));
                              in_ZMM7 = ZEXT3264(auVar88);
                              auVar193._0_4_ = auVar92._0_4_ * fVar79;
                              auVar193._4_4_ = auVar92._4_4_ * fVar119;
                              auVar193._8_4_ = auVar92._8_4_ * fVar120;
                              auVar193._12_4_ = auVar92._12_4_ * fVar121;
                              auVar193._16_4_ = auVar92._16_4_ * fVar122;
                              auVar193._20_4_ = auVar92._20_4_ * fVar123;
                              auVar193._24_4_ = auVar92._24_4_ * fVar124;
                              auVar193._28_4_ = 0;
                              auVar82 = vfmadd213ps_fma(auVar91,auVar114,auVar193);
                              auVar83 = vfmadd213ps_fma(auVar90,auVar113,ZEXT1632(auVar82));
                              auVar86 = vrcp14ps_avx512vl(auVar88);
                              in_ZMM6 = ZEXT3264(auVar86);
                              auVar87 = vxorps_avx512vl(auVar88,auVar84);
                              in_ZMM8 = ZEXT3264(auVar87);
                              auVar89 = auVar236._0_32_;
                              auVar84 = vfnmadd213ps_avx512vl(auVar86,auVar88,auVar89);
                              auVar82 = vfmadd132ps_fma(auVar84,auVar86,auVar86);
                              in_ZMM9 = ZEXT1664(auVar82);
                              local_2a60 = *(undefined1 (*) [32])(ray + 0x100);
                              in_ZMM10 = ZEXT3264(local_2a60);
                              auVar164._0_4_ = auVar82._0_4_ * (auVar83._0_4_ + auVar83._0_4_);
                              auVar164._4_4_ = auVar82._4_4_ * (auVar83._4_4_ + auVar83._4_4_);
                              auVar164._8_4_ = auVar82._8_4_ * (auVar83._8_4_ + auVar83._8_4_);
                              auVar164._12_4_ = auVar82._12_4_ * (auVar83._12_4_ + auVar83._12_4_);
                              auVar84 = ZEXT1632(auVar164);
                              auVar166 = ZEXT3264(auVar84);
                              uVar16 = vcmpps_avx512vl(auVar84,local_2a60,2);
                              uVar17 = vcmpps_avx512vl(auVar84,*(undefined1 (*) [32])(ray + 0x60),
                                                       0xd);
                              uVar18 = vcmpps_avx512vl(auVar88,auVar87,4);
                              bVar68 = bVar68 & (byte)uVar16 & (byte)uVar17 & (byte)uVar18;
                              if (bVar68 == 0) {
                                auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                auVar230 = ZEXT3264(auVar84);
                              }
                              else {
                                pGVar2 = (context->scene->geometries).items
                                         [*(uint *)(lVar70 + 0x40 + uVar77 * 4)].ptr;
                                uVar74 = pGVar2->mask;
                                auVar175._4_4_ = uVar74;
                                auVar175._0_4_ = uVar74;
                                auVar175._8_4_ = uVar74;
                                auVar175._12_4_ = uVar74;
                                auVar175._16_4_ = uVar74;
                                auVar175._20_4_ = uVar74;
                                auVar175._24_4_ = uVar74;
                                auVar175._28_4_ = uVar74;
                                in_ZMM6 = ZEXT3264(auVar175);
                                uVar16 = vptestmd_avx512vl(auVar175,*(undefined1 (*) [32])
                                                                     (ray + 0x120));
                                bVar68 = bVar68 & (byte)uVar16;
                                uVar66 = (ulong)bVar68;
                                auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                auVar230 = ZEXT3264(auVar86);
                                if (bVar68 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    uVar72 = vcmpps_avx512vl(auVar85,auVar235._0_32_,5);
                                    auVar86 = vrcp14ps_avx512vl(auVar85);
                                    auVar88 = vfnmadd213ps_avx512vl(auVar85,auVar86,auVar89);
                                    auVar86 = vfmadd132ps_avx512vl(auVar88,auVar86,auVar86);
                                    fVar131 = (float)((uint)((byte)uVar72 & 1) * auVar86._0_4_);
                                    fVar130 = (float)((uint)((byte)(uVar72 >> 1) & 1) *
                                                     auVar86._4_4_);
                                    auVar83._4_4_ = fVar130;
                                    auVar83._0_4_ = fVar131;
                                    fVar129 = (float)((uint)((byte)(uVar72 >> 2) & 1) *
                                                     auVar86._8_4_);
                                    auVar83._8_4_ = fVar129;
                                    fVar128 = (float)((uint)((byte)(uVar72 >> 3) & 1) *
                                                     auVar86._12_4_);
                                    auVar83._12_4_ = fVar128;
                                    fVar125 = (float)((uint)((byte)(uVar72 >> 4) & 1) *
                                                     auVar86._16_4_);
                                    fVar203 = (float)((uint)((byte)(uVar72 >> 5) & 1) *
                                                     auVar86._20_4_);
                                    fVar201 = (float)((uint)((byte)(uVar72 >> 6) & 1) *
                                                     auVar86._24_4_);
                                    in_ZMM11 = ZEXT3264(CONCAT428((uint)(byte)(uVar72 >> 7) *
                                                                  auVar86._28_4_,
                                                                  CONCAT424(fVar201,CONCAT420(
                                                  fVar203,CONCAT416(fVar125,auVar83)))));
                                    auVar55._4_4_ = fVar130 * auVar103._4_4_;
                                    auVar55._0_4_ = fVar131 * auVar103._0_4_;
                                    auVar55._8_4_ = fVar129 * auVar103._8_4_;
                                    auVar55._12_4_ = fVar128 * auVar103._12_4_;
                                    auVar55._16_4_ = fVar125 * auVar103._16_4_;
                                    auVar55._20_4_ = fVar203 * auVar103._20_4_;
                                    auVar55._24_4_ = fVar201 * auVar103._24_4_;
                                    auVar55._28_4_ = auVar103._28_4_;
                                    auVar86 = vminps_avx512vl(auVar55,auVar89);
                                    auVar56._4_4_ = fVar130 * auVar104._4_4_;
                                    auVar56._0_4_ = fVar131 * auVar104._0_4_;
                                    auVar56._8_4_ = fVar129 * auVar104._8_4_;
                                    auVar56._12_4_ = fVar128 * auVar104._12_4_;
                                    auVar56._16_4_ = fVar125 * auVar104._16_4_;
                                    auVar56._20_4_ = fVar203 * auVar104._20_4_;
                                    auVar56._24_4_ = fVar201 * auVar104._24_4_;
                                    auVar56._28_4_ = auVar104._28_4_;
                                    auVar88 = vminps_avx512vl(auVar56,auVar89);
                                    local_2980 = vsubps_avx512vl(auVar89,auVar86);
                                    local_2960 = vsubps_avx512vl(auVar89,auVar88);
                                    auVar156 = ZEXT3264(local_2960);
                                    pRVar5 = context->user;
                                    local_2920 = vpbroadcastd_avx512vl();
                                    in_ZMM6 = ZEXT3264(local_2920);
                                    local_2940 = vpbroadcastd_avx512vl();
                                    in_ZMM7 = ZEXT3264(local_2940);
                                    _local_29e0 = auVar113;
                                    _local_29c0 = auVar114;
                                    local_29a0._4_4_ = fVar119;
                                    local_29a0._0_4_ = fVar79;
                                    fStack_2998 = fVar120;
                                    fStack_2994 = fVar121;
                                    fStack_2990 = fVar122;
                                    fStack_298c = fVar123;
                                    fStack_2988 = fVar124;
                                    uStack_2984 = (uint)bVar76 * auVar94._28_4_ |
                                                  (uint)!bVar76 * auVar97._28_4_;
                                    auVar86 = vpcmpeqd_avx2(auVar114,auVar114);
                                    local_2a38[1] = auVar86;
                                    *local_2a38 = auVar86;
                                    local_2900 = pRVar5->instID[0];
                                    uStack_28fc = local_2900;
                                    uStack_28f8 = local_2900;
                                    uStack_28f4 = local_2900;
                                    uStack_28f0 = local_2900;
                                    uStack_28ec = local_2900;
                                    uStack_28e8 = local_2900;
                                    uStack_28e4 = local_2900;
                                    local_28e0 = pRVar5->instPrimID[0];
                                    uStack_28dc = local_28e0;
                                    uStack_28d8 = local_28e0;
                                    uStack_28d4 = local_28e0;
                                    uStack_28d0 = local_28e0;
                                    uStack_28cc = local_28e0;
                                    uStack_28c8 = local_28e0;
                                    uStack_28c4 = local_28e0;
                                    auVar84 = vblendmps_avx512vl(local_2a60,auVar84);
                                    bVar76 = (bool)(bVar68 >> 1 & 1);
                                    bVar7 = (bool)(bVar68 >> 2 & 1);
                                    bVar8 = (bool)(bVar68 >> 3 & 1);
                                    bVar9 = (bool)(bVar68 >> 4 & 1);
                                    bVar10 = (bool)(bVar68 >> 5 & 1);
                                    bVar11 = (bool)(bVar68 >> 6 & 1);
                                    *(uint *)(ray + 0x100) =
                                         (uint)(bVar68 & 1) * auVar84._0_4_ |
                                         !(bool)(bVar68 & 1) * local_28e0;
                                    *(uint *)(ray + 0x104) =
                                         (uint)bVar76 * auVar84._4_4_ | !bVar76 * local_28e0;
                                    *(uint *)(ray + 0x108) =
                                         (uint)bVar7 * auVar84._8_4_ | !bVar7 * local_28e0;
                                    *(uint *)(ray + 0x10c) =
                                         (uint)bVar8 * auVar84._12_4_ | !bVar8 * local_28e0;
                                    *(uint *)(ray + 0x110) =
                                         (uint)bVar9 * auVar84._16_4_ | !bVar9 * local_28e0;
                                    *(uint *)(ray + 0x114) =
                                         (uint)bVar10 * auVar84._20_4_ | !bVar10 * local_28e0;
                                    *(uint *)(ray + 0x118) =
                                         (uint)bVar11 * auVar84._24_4_ | !bVar11 * local_28e0;
                                    *(uint *)(ray + 0x11c) =
                                         (uint)(bVar68 >> 7) * auVar84._28_4_ |
                                         !(bool)(bVar68 >> 7) * local_28e0;
                                    local_2ae0 = vpmovm2d_avx512vl(uVar66);
                                    local_2ac0._0_4_ = SUB84(local_2ae0,0);
                                    local_2ac0._4_4_ = (undefined4)((ulong)local_2ae0 >> 0x20);
                                    fStack_2ab8 = SUB84(pGVar2->userPtr,0);
                                    fStack_2ab4 = (float)((ulong)pGVar2->userPtr >> 0x20);
                                    fStack_2ab0 = SUB84(context->user,0);
                                    fStack_2aac = (float)((ulong)context->user >> 0x20);
                                    local_2aa0._0_4_ = SUB84((RTCHitN *)local_29e0,0);
                                    local_2aa0._4_4_ = (float)((ulong)local_29e0 >> 0x20);
                                    fStack_2a98 = 1.12104e-44;
                                    local_2ac0 = (undefined1  [8])local_2ae0;
                                    local_2aa0 = (RTCHitN *)local_29e0;
                                    uStack_2aa8 = ray;
                                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      auVar156 = ZEXT1664(local_2960._0_16_);
                                      auVar166 = ZEXT1664(auVar164);
                                      in_ZMM6 = ZEXT1664(local_2920._0_16_);
                                      in_ZMM7 = ZEXT1664(local_2940._0_16_);
                                      in_ZMM8 = ZEXT1664(auVar87._0_16_);
                                      in_ZMM9 = ZEXT1664(auVar82);
                                      in_ZMM11 = ZEXT1664(auVar83);
                                      in_ZMM12 = ZEXT1664(auVar94._0_16_);
                                      in_ZMM13 = ZEXT1664(auVar96._0_16_);
                                      in_ZMM14 = ZEXT1664(auVar95._0_16_);
                                      in_ZMM15 = ZEXT1664(auVar85._0_16_);
                                      (*pGVar2->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)local_2ac0);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar232 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                      auVar233 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                      auVar230 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                      auVar239 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar238 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar237 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar236 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                      auVar235 = ZEXT3264(auVar84);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar234 = ZEXT3264(auVar84);
                                    }
                                    uVar66 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                                    if ((char)uVar66 != '\0') {
                                      p_Var6 = context->args->filter;
                                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                        auVar156 = ZEXT1664(auVar156._0_16_);
                                        auVar166 = ZEXT1664(auVar166._0_16_);
                                        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
                                        in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                                        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                        in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                        in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                        in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                        in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                        (*p_Var6)((RTCFilterFunctionNArguments *)local_2ac0);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar232 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                        auVar233 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                        auVar230 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                        auVar239 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar238 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        auVar237 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar236 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                                        auVar235 = ZEXT3264(auVar84);
                                        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar234 = ZEXT3264(auVar84);
                                      }
                                      uVar66 = vptestmd_avx512vl(local_2ae0,local_2ae0);
                                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      bVar76 = (bool)((byte)uVar66 & 1);
                                      auVar116._0_4_ =
                                           (uint)bVar76 * auVar84._0_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x100);
                                      bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
                                      auVar116._4_4_ =
                                           (uint)bVar76 * auVar84._4_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x104);
                                      bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
                                      auVar116._8_4_ =
                                           (uint)bVar76 * auVar84._8_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x108);
                                      bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
                                      auVar116._12_4_ =
                                           (uint)bVar76 * auVar84._12_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x10c);
                                      bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
                                      auVar116._16_4_ =
                                           (uint)bVar76 * auVar84._16_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x110);
                                      bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
                                      auVar116._20_4_ =
                                           (uint)bVar76 * auVar84._20_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x114);
                                      bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
                                      auVar116._24_4_ =
                                           (uint)bVar76 * auVar84._24_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x118);
                                      bVar76 = SUB81(uVar66 >> 7,0);
                                      auVar116._28_4_ =
                                           (uint)bVar76 * auVar84._28_4_ |
                                           (uint)!bVar76 * *(int *)(uStack_2aa8 + 0x11c);
                                      *(undefined1 (*) [32])(uStack_2aa8 + 0x100) = auVar116;
                                    }
                                    bVar76 = (bool)((byte)uVar66 & 1);
                                    auVar118._0_4_ =
                                         (uint)bVar76 * *(int *)local_2af0 |
                                         (uint)!bVar76 * local_2a60._0_4_;
                                    bVar76 = (bool)((byte)(uVar66 >> 1) & 1);
                                    auVar118._4_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 4) |
                                         (uint)!bVar76 * local_2a60._4_4_;
                                    bVar76 = (bool)((byte)(uVar66 >> 2) & 1);
                                    auVar118._8_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 8) |
                                         (uint)!bVar76 * local_2a60._8_4_;
                                    bVar76 = (bool)((byte)(uVar66 >> 3) & 1);
                                    auVar118._12_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 0xc) |
                                         (uint)!bVar76 * local_2a60._12_4_;
                                    bVar76 = (bool)((byte)(uVar66 >> 4) & 1);
                                    auVar118._16_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 0x10) |
                                         (uint)!bVar76 * local_2a60._16_4_;
                                    bVar76 = (bool)((byte)(uVar66 >> 5) & 1);
                                    auVar118._20_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 0x14) |
                                         (uint)!bVar76 * local_2a60._20_4_;
                                    bVar76 = (bool)((byte)(uVar66 >> 6) & 1);
                                    auVar118._24_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 0x18) |
                                         (uint)!bVar76 * local_2a60._24_4_;
                                    bVar76 = SUB81(uVar66 >> 7,0);
                                    auVar118._28_4_ =
                                         (uint)bVar76 * *(int *)(local_2af0 + 0x1c) |
                                         (uint)!bVar76 * local_2a60._28_4_;
                                    in_ZMM10 = ZEXT3264(auVar118);
                                    *(undefined1 (*) [32])local_2af0 = auVar118;
                                  }
                                  bVar73 = bVar73 & ~(byte)uVar66;
                                }
                              }
                            }
                            bVar76 = bVar73 != 0;
                          }
                          if ((!bVar76) || (bVar76 = 2 < uVar77, uVar77 = uVar77 + 1, bVar76))
                          break;
                        }
                        bVar63 = bVar63 & bVar73;
                      } while ((bVar63 != 0) && (uVar77 = local_2a28 + 1, uVar77 < local_2a30));
                      bVar63 = ~bVar63;
                    }
                    bVar64 = bVar64 | bVar63;
                    if (bVar64 == 0xff) goto LAB_007b11fb;
                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar76 = (bool)(bVar64 >> 1 & 1);
                    bVar7 = (bool)(bVar64 >> 2 & 1);
                    bVar8 = (bool)(bVar64 >> 3 & 1);
                    bVar9 = (bool)(bVar64 >> 4 & 1);
                    bVar10 = (bool)(bVar64 >> 5 & 1);
                    bVar11 = (bool)(bVar64 >> 6 & 1);
                    local_26a0._4_4_ =
                         (uint)bVar76 * auVar84._4_4_ | (uint)!bVar76 * local_26a0._4_4_;
                    local_26a0._0_4_ =
                         (uint)(bVar64 & 1) * auVar84._0_4_ |
                         (uint)!(bool)(bVar64 & 1) * local_26a0._0_4_;
                    local_26a0._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * local_26a0._8_4_
                    ;
                    local_26a0._12_4_ =
                         (uint)bVar8 * auVar84._12_4_ | (uint)!bVar8 * local_26a0._12_4_;
                    local_26a0._16_4_ =
                         (uint)bVar9 * auVar84._16_4_ | (uint)!bVar9 * local_26a0._16_4_;
                    local_26a0._20_4_ =
                         (uint)bVar10 * auVar84._20_4_ | (uint)!bVar10 * local_26a0._20_4_;
                    local_26a0._24_4_ =
                         (uint)bVar11 * auVar84._24_4_ | (uint)!bVar11 * local_26a0._24_4_;
                    local_26a0._28_4_ =
                         (uint)(bVar64 >> 7) * auVar84._28_4_ |
                         (uint)!(bool)(bVar64 >> 7) * local_26a0._28_4_;
                    iVar65 = 0;
                    break;
                  }
                  goto LAB_007b120c;
                }
                uVar66 = root.ptr & 0xfffffffffffffff0;
                auVar231 = ZEXT3264(auVar238._0_32_);
                uVar77 = 0;
                root.ptr = 8;
                do {
                  uVar72 = *(ulong *)(uVar66 + uVar77 * 8);
                  if (uVar72 != 8) {
                    uVar67 = *(undefined4 *)(uVar66 + 0x80 + uVar77 * 4);
                    auVar144._4_4_ = uVar67;
                    auVar144._0_4_ = uVar67;
                    auVar144._8_4_ = uVar67;
                    auVar144._12_4_ = uVar67;
                    auVar144._16_4_ = uVar67;
                    auVar144._20_4_ = uVar67;
                    auVar144._24_4_ = uVar67;
                    auVar144._28_4_ = uVar67;
                    auVar85 = *(undefined1 (*) [32])(ray + 0xe0);
                    uVar67 = *(undefined4 *)(uVar66 + 0x20 + uVar77 * 4);
                    auVar19._4_4_ = uVar67;
                    auVar19._0_4_ = uVar67;
                    auVar19._8_4_ = uVar67;
                    auVar19._12_4_ = uVar67;
                    auVar19._16_4_ = uVar67;
                    auVar19._20_4_ = uVar67;
                    auVar19._24_4_ = uVar67;
                    auVar19._28_4_ = uVar67;
                    auVar86 = vfmadd213ps_avx512vl(auVar144,auVar85,auVar19);
                    uVar67 = *(undefined4 *)(uVar66 + 0xa0 + uVar77 * 4);
                    auVar153._4_4_ = uVar67;
                    auVar153._0_4_ = uVar67;
                    auVar153._8_4_ = uVar67;
                    auVar153._12_4_ = uVar67;
                    auVar153._16_4_ = uVar67;
                    auVar153._20_4_ = uVar67;
                    auVar153._24_4_ = uVar67;
                    auVar153._28_4_ = uVar67;
                    uVar67 = *(undefined4 *)(uVar66 + 0x40 + uVar77 * 4);
                    auVar20._4_4_ = uVar67;
                    auVar20._0_4_ = uVar67;
                    auVar20._8_4_ = uVar67;
                    auVar20._12_4_ = uVar67;
                    auVar20._16_4_ = uVar67;
                    auVar20._20_4_ = uVar67;
                    auVar20._24_4_ = uVar67;
                    auVar20._28_4_ = uVar67;
                    auVar87 = vfmadd213ps_avx512vl(auVar153,auVar85,auVar20);
                    uVar67 = *(undefined4 *)(uVar66 + 0xc0 + uVar77 * 4);
                    auVar165._4_4_ = uVar67;
                    auVar165._0_4_ = uVar67;
                    auVar165._8_4_ = uVar67;
                    auVar165._12_4_ = uVar67;
                    auVar165._16_4_ = uVar67;
                    auVar165._20_4_ = uVar67;
                    auVar165._24_4_ = uVar67;
                    auVar165._28_4_ = uVar67;
                    uVar67 = *(undefined4 *)(uVar66 + 0x60 + uVar77 * 4);
                    auVar21._4_4_ = uVar67;
                    auVar21._0_4_ = uVar67;
                    auVar21._8_4_ = uVar67;
                    auVar21._12_4_ = uVar67;
                    auVar21._16_4_ = uVar67;
                    auVar21._20_4_ = uVar67;
                    auVar21._24_4_ = uVar67;
                    auVar21._28_4_ = uVar67;
                    auVar88 = vfmadd213ps_avx512vl(auVar165,auVar85,auVar21);
                    uVar67 = *(undefined4 *)(uVar66 + 0x90 + uVar77 * 4);
                    auVar174._4_4_ = uVar67;
                    auVar174._0_4_ = uVar67;
                    auVar174._8_4_ = uVar67;
                    auVar174._12_4_ = uVar67;
                    auVar174._16_4_ = uVar67;
                    auVar174._20_4_ = uVar67;
                    auVar174._24_4_ = uVar67;
                    auVar174._28_4_ = uVar67;
                    uVar67 = *(undefined4 *)(uVar66 + 0x30 + uVar77 * 4);
                    auVar22._4_4_ = uVar67;
                    auVar22._0_4_ = uVar67;
                    auVar22._8_4_ = uVar67;
                    auVar22._12_4_ = uVar67;
                    auVar22._16_4_ = uVar67;
                    auVar22._20_4_ = uVar67;
                    auVar22._24_4_ = uVar67;
                    auVar22._28_4_ = uVar67;
                    auVar89 = vfmadd213ps_avx512vl(auVar174,auVar85,auVar22);
                    uVar67 = *(undefined4 *)(uVar66 + 0xb0 + uVar77 * 4);
                    auVar183._4_4_ = uVar67;
                    auVar183._0_4_ = uVar67;
                    auVar183._8_4_ = uVar67;
                    auVar183._12_4_ = uVar67;
                    auVar183._16_4_ = uVar67;
                    auVar183._20_4_ = uVar67;
                    auVar183._24_4_ = uVar67;
                    auVar183._28_4_ = uVar67;
                    uVar67 = *(undefined4 *)(uVar66 + 0x50 + uVar77 * 4);
                    auVar23._4_4_ = uVar67;
                    auVar23._0_4_ = uVar67;
                    auVar23._8_4_ = uVar67;
                    auVar23._12_4_ = uVar67;
                    auVar23._16_4_ = uVar67;
                    auVar23._20_4_ = uVar67;
                    auVar23._24_4_ = uVar67;
                    auVar23._28_4_ = uVar67;
                    auVar90 = vfmadd213ps_avx512vl(auVar183,auVar85,auVar23);
                    uVar67 = *(undefined4 *)(uVar66 + 0xd0 + uVar77 * 4);
                    auVar191._4_4_ = uVar67;
                    auVar191._0_4_ = uVar67;
                    auVar191._8_4_ = uVar67;
                    auVar191._12_4_ = uVar67;
                    auVar191._16_4_ = uVar67;
                    auVar191._20_4_ = uVar67;
                    auVar191._24_4_ = uVar67;
                    auVar191._28_4_ = uVar67;
                    uVar67 = *(undefined4 *)(uVar66 + 0x70 + uVar77 * 4);
                    auVar24._4_4_ = uVar67;
                    auVar24._0_4_ = uVar67;
                    auVar24._8_4_ = uVar67;
                    auVar24._12_4_ = uVar67;
                    auVar24._16_4_ = uVar67;
                    auVar24._20_4_ = uVar67;
                    auVar24._24_4_ = uVar67;
                    auVar24._28_4_ = uVar67;
                    auVar91 = vfmadd213ps_avx512vl(auVar191,auVar85,auVar24);
                    in_ZMM8 = ZEXT3264(auVar91);
                    auVar57._8_8_ = local_2840._8_8_;
                    auVar57._0_8_ = local_2840._0_8_;
                    auVar57._16_8_ = local_2840._16_8_;
                    auVar57._24_8_ = local_2840._24_8_;
                    in_ZMM9 = ZEXT3264(auVar57);
                    auVar58._8_8_ = local_2840._40_8_;
                    auVar58._0_8_ = local_2840._32_8_;
                    auVar58._16_8_ = local_2840._48_8_;
                    auVar58._24_8_ = local_2840._56_8_;
                    in_ZMM10 = ZEXT3264(auVar58);
                    auVar59._8_8_ = local_2840._72_8_;
                    auVar59._0_8_ = local_2840._64_8_;
                    auVar59._16_8_ = local_2840._80_8_;
                    auVar59._24_8_ = local_2840._88_8_;
                    in_ZMM11 = ZEXT3264(auVar59);
                    in_ZMM12 = ZEXT3264(local_2780);
                    auVar86 = vsubps_avx(auVar86,auVar57);
                    auVar156._0_4_ = local_2780._0_4_ * auVar86._0_4_;
                    auVar156._4_4_ = local_2780._4_4_ * auVar86._4_4_;
                    auVar156._8_4_ = local_2780._8_4_ * auVar86._8_4_;
                    auVar156._12_4_ = local_2780._12_4_ * auVar86._12_4_;
                    auVar156._16_4_ = local_2780._16_4_ * auVar86._16_4_;
                    auVar156._20_4_ = local_2780._20_4_ * auVar86._20_4_;
                    auVar156._28_36_ = in_ZMM13._28_36_;
                    auVar156._24_4_ = local_2780._24_4_ * auVar86._24_4_;
                    auVar92 = auVar156._0_32_;
                    in_ZMM13 = ZEXT3264(auVar92);
                    auVar86 = vsubps_avx(auVar87,auVar58);
                    auVar166._0_4_ = auVar86._0_4_ * (float)local_2760._0_4_;
                    auVar166._4_4_ = auVar86._4_4_ * (float)local_2760._4_4_;
                    auVar166._8_4_ = auVar86._8_4_ * fStack_2758;
                    auVar166._12_4_ = auVar86._12_4_ * fStack_2754;
                    auVar166._16_4_ = auVar86._16_4_ * fStack_2750;
                    auVar166._20_4_ = auVar86._20_4_ * fStack_274c;
                    auVar166._28_36_ = in_ZMM14._28_36_;
                    auVar166._24_4_ = auVar86._24_4_ * fStack_2748;
                    auVar93 = auVar166._0_32_;
                    in_ZMM14 = ZEXT3264(auVar93);
                    auVar86 = vsubps_avx(auVar88,auVar59);
                    auVar227._0_4_ = auVar86._0_4_ * (float)local_2740._0_4_;
                    auVar227._4_4_ = auVar86._4_4_ * (float)local_2740._4_4_;
                    auVar227._8_4_ = auVar86._8_4_ * fStack_2738;
                    auVar227._12_4_ = auVar86._12_4_ * fStack_2734;
                    auVar227._16_4_ = auVar86._16_4_ * fStack_2730;
                    auVar227._20_4_ = auVar86._20_4_ * fStack_272c;
                    auVar227._28_36_ = in_ZMM15._28_36_;
                    auVar227._24_4_ = auVar86._24_4_ * fStack_2728;
                    auVar110 = auVar227._0_32_;
                    in_ZMM15 = ZEXT3264(auVar110);
                    auVar86 = vsubps_avx(auVar89,auVar57);
                    auVar41._4_4_ = local_2780._4_4_ * auVar86._4_4_;
                    auVar41._0_4_ = local_2780._0_4_ * auVar86._0_4_;
                    auVar41._8_4_ = local_2780._8_4_ * auVar86._8_4_;
                    auVar41._12_4_ = local_2780._12_4_ * auVar86._12_4_;
                    auVar41._16_4_ = local_2780._16_4_ * auVar86._16_4_;
                    auVar41._20_4_ = local_2780._20_4_ * auVar86._20_4_;
                    auVar41._24_4_ = local_2780._24_4_ * auVar86._24_4_;
                    auVar41._28_4_ = auVar89._28_4_;
                    auVar86 = vsubps_avx(auVar90,auVar58);
                    auVar42._4_4_ = auVar86._4_4_ * (float)local_2760._4_4_;
                    auVar42._0_4_ = auVar86._0_4_ * (float)local_2760._0_4_;
                    auVar42._8_4_ = auVar86._8_4_ * fStack_2758;
                    auVar42._12_4_ = auVar86._12_4_ * fStack_2754;
                    auVar42._16_4_ = auVar86._16_4_ * fStack_2750;
                    auVar42._20_4_ = auVar86._20_4_ * fStack_274c;
                    auVar42._24_4_ = auVar86._24_4_ * fStack_2748;
                    auVar42._28_4_ = uStack_2744;
                    auVar86 = vsubps_avx(auVar91,auVar59);
                    auVar43._4_4_ = auVar86._4_4_ * (float)local_2740._4_4_;
                    auVar43._0_4_ = auVar86._0_4_ * (float)local_2740._0_4_;
                    auVar43._8_4_ = auVar86._8_4_ * fStack_2738;
                    auVar43._12_4_ = auVar86._12_4_ * fStack_2734;
                    auVar43._16_4_ = auVar86._16_4_ * fStack_2730;
                    auVar43._20_4_ = auVar86._20_4_ * fStack_272c;
                    auVar43._24_4_ = auVar86._24_4_ * fStack_2728;
                    auVar43._28_4_ = uStack_2724;
                    auVar86 = vpminsd_avx2(auVar92,auVar41);
                    auVar87 = vpminsd_avx2(auVar93,auVar42);
                    auVar86 = vpmaxsd_avx2(auVar86,auVar87);
                    auVar87 = vpminsd_avx2(auVar110,auVar43);
                    in_ZMM7 = ZEXT3264(auVar87);
                    auVar86 = vpmaxsd_avx2(auVar86,auVar87);
                    auVar88 = vmulps_avx512vl(auVar86,auVar239._0_32_);
                    auVar86 = vpmaxsd_avx2(auVar92,auVar41);
                    in_ZMM6 = ZEXT3264(auVar86);
                    auVar87 = vpmaxsd_avx2(auVar93,auVar42);
                    auVar87 = vpminsd_avx2(auVar86,auVar87);
                    auVar86 = vpmaxsd_avx2(auVar110,auVar43);
                    auVar86 = vpminsd_avx2(auVar87,auVar86);
                    auVar87 = vmulps_avx512vl(auVar86,auVar230._0_32_);
                    auVar86 = vpmaxsd_avx2(auVar88,local_26c0);
                    auVar156 = ZEXT3264(auVar86);
                    auVar87 = vpminsd_avx2(auVar87,local_26a0);
                    auVar166 = ZEXT3264(auVar87);
                    uVar78 = vcmpps_avx512vl(auVar86,auVar87,2);
                    if ((uVar74 & 7) == 6) {
                      uVar67 = *(undefined4 *)(uVar66 + 0xe0 + uVar77 * 4);
                      auVar25._4_4_ = uVar67;
                      auVar25._0_4_ = uVar67;
                      auVar25._8_4_ = uVar67;
                      auVar25._12_4_ = uVar67;
                      auVar25._16_4_ = uVar67;
                      auVar25._20_4_ = uVar67;
                      auVar25._24_4_ = uVar67;
                      auVar25._28_4_ = uVar67;
                      uVar14 = vcmpps_avx512vl(auVar85,auVar25,0xd);
                      uVar67 = *(undefined4 *)(uVar66 + 0xf0 + uVar77 * 4);
                      auVar26._4_4_ = uVar67;
                      auVar26._0_4_ = uVar67;
                      auVar26._8_4_ = uVar67;
                      auVar26._12_4_ = uVar67;
                      auVar26._16_4_ = uVar67;
                      auVar26._20_4_ = uVar67;
                      auVar26._24_4_ = uVar67;
                      auVar26._28_4_ = uVar67;
                      uVar15 = vcmpps_avx512vl(auVar85,auVar26,1);
                      uVar78 = uVar78 & uVar14 & uVar15;
                    }
                    uVar14 = vcmpps_avx512vl(local_26a0,auVar84,6);
                    uVar78 = uVar78 & uVar14;
                    if ((byte)uVar78 != 0) {
                      auVar86 = vblendmps_avx512vl(auVar238._0_32_,auVar88);
                      bVar76 = (bool)((byte)uVar78 & 1);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = (bool)((byte)(uVar78 >> 3) & 1);
                      bVar10 = (bool)((byte)(uVar78 >> 4) & 1);
                      bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
                      bVar12 = (bool)((byte)(uVar78 >> 6) & 1);
                      bVar13 = SUB81(uVar78 >> 7,0);
                      if (root.ptr != 8) {
                        *puVar75 = root.ptr;
                        puVar75 = puVar75 + 1;
                        *pauVar69 = auVar231._0_32_;
                        pauVar69 = pauVar69 + 1;
                      }
                      auVar231 = ZEXT3264(CONCAT428((uint)bVar13 * auVar86._28_4_ |
                                                    (uint)!bVar13 * auVar85._28_4_,
                                                    CONCAT424((uint)bVar12 * auVar86._24_4_ |
                                                              (uint)!bVar12 * auVar85._24_4_,
                                                              CONCAT420((uint)bVar11 *
                                                                        auVar86._20_4_ |
                                                                        (uint)!bVar11 *
                                                                        auVar85._20_4_,
                                                                        CONCAT416((uint)bVar10 *
                                                                                  auVar86._16_4_ |
                                                                                  (uint)!bVar10 *
                                                                                  auVar85._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar9 * auVar86._12_4_ |
                                                  (uint)!bVar9 * auVar85._12_4_,
                                                  CONCAT48((uint)bVar8 * auVar86._8_4_ |
                                                           (uint)!bVar8 * auVar85._8_4_,
                                                           CONCAT44((uint)bVar7 * auVar86._4_4_ |
                                                                    (uint)!bVar7 * auVar85._4_4_,
                                                                    (uint)bVar76 * auVar86._0_4_ |
                                                                    (uint)!bVar76 * auVar85._0_4_)))
                                                  )))));
                      root.ptr = uVar72;
                    }
                  }
                } while ((uVar72 != 8) && (bVar76 = uVar77 < 3, uVar77 = uVar77 + 1, bVar76));
                iVar65 = 0;
                if (root.ptr == 8) {
LAB_007afe79:
                  bVar76 = false;
                  iVar65 = 4;
                }
                else {
                  uVar16 = vcmpps_avx512vl(auVar231._0_32_,local_26a0,9);
                  bVar76 = true;
                  if ((uint)POPCOUNT((int)uVar16) <= uVar71) {
                    *puVar75 = root.ptr;
                    puVar75 = puVar75 + 1;
                    *pauVar69 = auVar231._0_32_;
                    pauVar69 = pauVar69 + 1;
                    goto LAB_007afe79;
                  }
                }
              } while (bVar76);
            }
          }
        }
      } while (iVar65 != 3);
      bVar64 = bVar64 & (byte)local_2ae4;
      bVar76 = (bool)(bVar64 >> 1 & 1);
      bVar7 = (bool)(bVar64 >> 2 & 1);
      bVar8 = (bool)(bVar64 >> 3 & 1);
      bVar9 = (bool)(bVar64 >> 4 & 1);
      bVar10 = (bool)(bVar64 >> 5 & 1);
      bVar11 = (bool)(bVar64 >> 6 & 1);
      *(uint *)local_2af0 =
           (uint)(bVar64 & 1) * auVar237._0_4_ | (uint)!(bool)(bVar64 & 1) * *(int *)local_2af0;
      *(uint *)(local_2af0 + 4) =
           (uint)bVar76 * auVar237._4_4_ | (uint)!bVar76 * *(int *)(local_2af0 + 4);
      *(uint *)(local_2af0 + 8) =
           (uint)bVar7 * auVar237._8_4_ | (uint)!bVar7 * *(int *)(local_2af0 + 8);
      *(uint *)(local_2af0 + 0xc) =
           (uint)bVar8 * auVar237._12_4_ | (uint)!bVar8 * *(int *)(local_2af0 + 0xc);
      *(uint *)(local_2af0 + 0x10) =
           (uint)bVar9 * auVar237._16_4_ | (uint)!bVar9 * *(int *)(local_2af0 + 0x10);
      *(uint *)(local_2af0 + 0x14) =
           (uint)bVar10 * auVar237._20_4_ | (uint)!bVar10 * *(int *)(local_2af0 + 0x14);
      *(uint *)(local_2af0 + 0x18) =
           (uint)bVar11 * auVar237._24_4_ | (uint)!bVar11 * *(int *)(local_2af0 + 0x18);
      *(uint *)(local_2af0 + 0x1c) =
           (uint)(bVar64 >> 7) * auVar237._28_4_ |
           (uint)!(bool)(bVar64 >> 7) * *(int *)(local_2af0 + 0x1c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }